

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  code *pcVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  long lVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [28];
  ulong uVar85;
  RTCIntersectArguments *pRVar86;
  uint uVar87;
  ulong uVar88;
  uint uVar89;
  ulong uVar90;
  long lVar91;
  ulong uVar92;
  bool bVar93;
  undefined4 uVar94;
  undefined8 uVar95;
  float fVar111;
  vint4 bi_2;
  undefined1 auVar96 [16];
  float fVar109;
  float fVar113;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar110;
  float fVar112;
  float fVar114;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar100 [16];
  undefined1 auVar108 [32];
  float fVar118;
  float fVar134;
  vint4 bi_1;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar122 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  float fVar135;
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar146 [32];
  undefined1 auVar140 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  float fVar150;
  float fVar154;
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 ai;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 bi;
  undefined1 auVar172 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar194 [64];
  undefined4 uVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar203 [16];
  undefined8 uVar205;
  undefined8 uVar206;
  undefined8 uVar207;
  undefined1 auVar204 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined1 local_840 [4];
  undefined1 auStack_83c [8];
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_800 [32];
  undefined8 local_7c0;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 (*local_640) [16];
  Precalculations *local_638;
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined1 local_570 [8];
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar92 = (ulong)(byte)PVar9;
  lVar74 = uVar92 * 0x19;
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar136 = *(float *)(prim + lVar74 + 0x12);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + lVar74 + 6));
  auVar96._0_4_ = fVar136 * auVar14._0_4_;
  auVar96._4_4_ = fVar136 * auVar14._4_4_;
  auVar96._8_4_ = fVar136 * auVar14._8_4_;
  auVar96._12_4_ = fVar136 * auVar14._12_4_;
  auVar162._0_4_ = fVar136 * auVar15._0_4_;
  auVar162._4_4_ = fVar136 * auVar15._4_4_;
  auVar162._8_4_ = fVar136 * auVar15._8_4_;
  auVar162._12_4_ = fVar136 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar92 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar85 = (ulong)(uint)((int)(uVar92 * 9) * 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + uVar92 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar85 = (ulong)(uint)((int)(uVar92 * 5) << 2);
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar211._4_4_ = auVar162._0_4_;
  auVar211._0_4_ = auVar162._0_4_;
  auVar211._8_4_ = auVar162._0_4_;
  auVar211._12_4_ = auVar162._0_4_;
  auVar120 = vshufps_avx(auVar162,auVar162,0x55);
  auVar97 = vshufps_avx(auVar162,auVar162,0xaa);
  fVar136 = auVar97._0_4_;
  auVar199._0_4_ = fVar136 * auVar16._0_4_;
  fVar109 = auVar97._4_4_;
  auVar199._4_4_ = fVar109 * auVar16._4_4_;
  fVar111 = auVar97._8_4_;
  auVar199._8_4_ = fVar111 * auVar16._8_4_;
  fVar113 = auVar97._12_4_;
  auVar199._12_4_ = fVar113 * auVar16._12_4_;
  auVar193._0_4_ = auVar19._0_4_ * fVar136;
  auVar193._4_4_ = auVar19._4_4_ * fVar109;
  auVar193._8_4_ = auVar19._8_4_ * fVar111;
  auVar193._12_4_ = auVar19._12_4_ * fVar113;
  auVar181._0_4_ = auVar137._0_4_ * fVar136;
  auVar181._4_4_ = auVar137._4_4_ * fVar109;
  auVar181._8_4_ = auVar137._8_4_ * fVar111;
  auVar181._12_4_ = auVar137._12_4_ * fVar113;
  auVar97 = vfmadd231ps_fma(auVar199,auVar120,auVar15);
  auVar121 = vfmadd231ps_fma(auVar193,auVar120,auVar18);
  auVar120 = vfmadd231ps_fma(auVar181,auVar98,auVar120);
  auVar151 = vfmadd231ps_fma(auVar97,auVar211,auVar14);
  auVar202 = ZEXT1664(auVar151);
  auVar121 = vfmadd231ps_fma(auVar121,auVar211,auVar17);
  auVar156 = vfmadd231ps_fma(auVar120,auVar99,auVar211);
  auVar212._4_4_ = auVar96._0_4_;
  auVar212._0_4_ = auVar96._0_4_;
  auVar212._8_4_ = auVar96._0_4_;
  auVar212._12_4_ = auVar96._0_4_;
  auVar120 = vshufps_avx(auVar96,auVar96,0x55);
  auVar97 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar136 = auVar97._0_4_;
  auVar163._0_4_ = fVar136 * auVar16._0_4_;
  fVar109 = auVar97._4_4_;
  auVar163._4_4_ = fVar109 * auVar16._4_4_;
  fVar111 = auVar97._8_4_;
  auVar163._8_4_ = fVar111 * auVar16._8_4_;
  fVar113 = auVar97._12_4_;
  auVar163._12_4_ = fVar113 * auVar16._12_4_;
  auVar119._0_4_ = auVar19._0_4_ * fVar136;
  auVar119._4_4_ = auVar19._4_4_ * fVar109;
  auVar119._8_4_ = auVar19._8_4_ * fVar111;
  auVar119._12_4_ = auVar19._12_4_ * fVar113;
  auVar97._0_4_ = auVar137._0_4_ * fVar136;
  auVar97._4_4_ = auVar137._4_4_ * fVar109;
  auVar97._8_4_ = auVar137._8_4_ * fVar111;
  auVar97._12_4_ = auVar137._12_4_ * fVar113;
  auVar15 = vfmadd231ps_fma(auVar163,auVar120,auVar15);
  auVar16 = vfmadd231ps_fma(auVar119,auVar120,auVar18);
  auVar18 = vfmadd231ps_fma(auVar97,auVar120,auVar98);
  auVar19 = vfmadd231ps_fma(auVar15,auVar212,auVar14);
  auVar98 = vfmadd231ps_fma(auVar16,auVar212,auVar17);
  auVar137 = vfmadd231ps_fma(auVar18,auVar212,auVar99);
  local_2f0._8_4_ = 0x7fffffff;
  local_2f0._0_8_ = 0x7fffffff7fffffff;
  local_2f0._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar151,local_2f0);
  auVar155._8_4_ = 0x219392ef;
  auVar155._0_8_ = 0x219392ef219392ef;
  auVar155._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar155,1);
  auVar15 = vblendvps_avx(auVar151,auVar155,auVar14);
  auVar14 = vandps_avx(auVar121,local_2f0);
  auVar14 = vcmpps_avx(auVar14,auVar155,1);
  auVar16 = vblendvps_avx(auVar121,auVar155,auVar14);
  auVar14 = vandps_avx(auVar156,local_2f0);
  auVar14 = vcmpps_avx(auVar14,auVar155,1);
  auVar14 = vblendvps_avx(auVar156,auVar155,auVar14);
  auVar17 = vrcpps_avx(auVar15);
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = &DAT_3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar176);
  auVar17 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar176);
  auVar18 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar16 = vfnmadd213ps_fma(auVar14,auVar15,auVar176);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar92 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar99 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar19);
  auVar156._0_4_ = auVar17._0_4_ * auVar14._0_4_;
  auVar156._4_4_ = auVar17._4_4_ * auVar14._4_4_;
  auVar156._8_4_ = auVar17._8_4_ * auVar14._8_4_;
  auVar156._12_4_ = auVar17._12_4_ * auVar14._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar92 * 9 + 6);
  auVar14 = vpmovsxwd_avx(auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar19);
  auVar164._0_4_ = auVar17._0_4_ * auVar14._0_4_;
  auVar164._4_4_ = auVar17._4_4_ * auVar14._4_4_;
  auVar164._8_4_ = auVar17._8_4_ * auVar14._8_4_;
  auVar164._12_4_ = auVar17._12_4_ * auVar14._12_4_;
  auVar121._1_3_ = 0;
  auVar121[0] = PVar9;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar92 * -2 + 6);
  auVar14 = vpmovsxwd_avx(auVar17);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar98);
  auVar182._0_4_ = auVar14._0_4_ * auVar18._0_4_;
  auVar182._4_4_ = auVar14._4_4_ * auVar18._4_4_;
  auVar182._8_4_ = auVar14._8_4_ * auVar18._8_4_;
  auVar182._12_4_ = auVar14._12_4_ * auVar18._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar14 = vsubps_avx(auVar14,auVar98);
  auVar120._0_4_ = auVar18._0_4_ * auVar14._0_4_;
  auVar120._4_4_ = auVar18._4_4_ * auVar14._4_4_;
  auVar120._8_4_ = auVar18._8_4_ * auVar14._8_4_;
  auVar120._12_4_ = auVar18._12_4_ * auVar14._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar85 + uVar92 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar137);
  auVar151._0_4_ = auVar99._0_4_ * auVar14._0_4_;
  auVar151._4_4_ = auVar99._4_4_ * auVar14._4_4_;
  auVar151._8_4_ = auVar99._8_4_ * auVar14._8_4_;
  auVar151._12_4_ = auVar99._12_4_ * auVar14._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar92 * 0x17 + 6);
  auVar14 = vpmovsxwd_avx(auVar19);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar137);
  auVar98._0_4_ = auVar99._0_4_ * auVar14._0_4_;
  auVar98._4_4_ = auVar99._4_4_ * auVar14._4_4_;
  auVar98._8_4_ = auVar99._8_4_ * auVar14._8_4_;
  auVar98._12_4_ = auVar99._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar156,auVar164);
  auVar15 = vpminsd_avx(auVar182,auVar120);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar151,auVar98);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar185._4_4_ = uVar94;
  auVar185._0_4_ = uVar94;
  auVar185._8_4_ = uVar94;
  auVar185._12_4_ = uVar94;
  auVar15 = vmaxps_avx(auVar15,auVar185);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_300._0_4_ = auVar14._0_4_ * 0.99999964;
  local_300._4_4_ = auVar14._4_4_ * 0.99999964;
  local_300._8_4_ = auVar14._8_4_ * 0.99999964;
  local_300._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar156,auVar164);
  auVar15 = vpmaxsd_avx(auVar182,auVar120);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar151,auVar98);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar137._4_4_ = uVar94;
  auVar137._0_4_ = uVar94;
  auVar137._8_4_ = uVar94;
  auVar137._12_4_ = uVar94;
  auVar15 = vminps_avx(auVar15,auVar137);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar99._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar99._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar99._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar99._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar121[4] = PVar9;
  auVar121._5_3_ = 0;
  auVar121[8] = PVar9;
  auVar121._9_3_ = 0;
  auVar121[0xc] = PVar9;
  auVar121._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar121,_DAT_01ff0cf0);
  auVar14 = vcmpps_avx(local_300,auVar99,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar87 = vmovmskps_avx(auVar14);
  bVar93 = uVar87 != 0;
  if (bVar93) {
    uVar87 = uVar87 & 0xff;
    local_4a0 = mm_lookupmask_ps._16_8_;
    uStack_498 = mm_lookupmask_ps._24_8_;
    uStack_490 = mm_lookupmask_ps._16_8_;
    uStack_488 = mm_lookupmask_ps._24_8_;
    local_640 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    local_638 = pre;
    do {
      auVar130 = auVar202._0_32_;
      lVar23 = 0;
      uVar92 = (ulong)uVar87;
      for (uVar85 = uVar92; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar92 = uVar92 - 1 & uVar92;
      local_580 = *(undefined4 *)(prim + lVar23 * 4 + 6);
      uVar85 = (ulong)(uint)((int)lVar23 << 6);
      uVar87 = *(uint *)(prim + 2);
      local_788 = (ulong)uVar87;
      pGVar11 = (context->scene->geometries).items[local_788].ptr;
      pPVar1 = prim + uVar85 + lVar74 + 0x16;
      local_710 = *(undefined8 *)pPVar1;
      uStack_708 = *(undefined8 *)(pPVar1 + 8);
      if (uVar92 != 0) {
        uVar88 = uVar92 - 1 & uVar92;
        for (uVar90 = uVar92; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
        }
        if (uVar88 != 0) {
          for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_4b0 = *(undefined1 (*) [16])(prim + uVar85 + lVar74 + 0x26);
      local_4c0 = *(undefined1 (*) [16])(prim + uVar85 + lVar74 + 0x36);
      local_4d0 = *(undefined1 (*) [16])(prim + uVar85 + lVar74 + 0x46);
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar17 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar15 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar17);
      uVar94 = auVar15._0_4_;
      auVar157._4_4_ = uVar94;
      auVar157._0_4_ = uVar94;
      auVar157._8_4_ = uVar94;
      auVar157._12_4_ = uVar94;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar136 = pre->ray_space[k].vz.field_0.m128[0];
      fVar109 = pre->ray_space[k].vz.field_0.m128[1];
      fVar111 = pre->ray_space[k].vz.field_0.m128[2];
      fVar113 = pre->ray_space[k].vz.field_0.m128[3];
      auVar170._0_4_ = fVar136 * auVar15._0_4_;
      auVar170._4_4_ = fVar109 * auVar15._4_4_;
      auVar170._8_4_ = fVar111 * auVar15._8_4_;
      auVar170._12_4_ = fVar113 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar6,auVar14);
      auVar19 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar157);
      auVar14 = vblendps_avx(auVar19,*(undefined1 (*) [16])pPVar1,8);
      auVar16 = vsubps_avx(local_4b0,auVar17);
      uVar94 = auVar16._0_4_;
      auVar171._4_4_ = uVar94;
      auVar171._0_4_ = uVar94;
      auVar171._8_4_ = uVar94;
      auVar171._12_4_ = uVar94;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar186._0_4_ = fVar136 * auVar16._0_4_;
      auVar186._4_4_ = fVar109 * auVar16._4_4_;
      auVar186._8_4_ = fVar111 * auVar16._8_4_;
      auVar186._12_4_ = fVar113 * auVar16._12_4_;
      auVar15 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar15);
      auVar99 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar171);
      auVar15 = vblendps_avx(auVar99,local_4b0,8);
      auVar18 = vsubps_avx(local_4c0,auVar17);
      uVar94 = auVar18._0_4_;
      auVar177._4_4_ = uVar94;
      auVar177._0_4_ = uVar94;
      auVar177._8_4_ = uVar94;
      auVar177._12_4_ = uVar94;
      auVar16 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar200._0_4_ = fVar136 * auVar18._0_4_;
      auVar200._4_4_ = fVar109 * auVar18._4_4_;
      auVar200._8_4_ = fVar111 * auVar18._8_4_;
      auVar200._12_4_ = fVar113 * auVar18._12_4_;
      auVar16 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar6,auVar16);
      auVar98 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar177);
      auVar16 = vblendps_avx(auVar98,local_4c0,8);
      auVar18 = vsubps_avx(local_4d0,auVar17);
      uVar94 = auVar18._0_4_;
      auVar178._4_4_ = uVar94;
      auVar178._0_4_ = uVar94;
      auVar178._8_4_ = uVar94;
      auVar178._12_4_ = uVar94;
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar203._0_4_ = fVar136 * auVar18._0_4_;
      auVar203._4_4_ = fVar109 * auVar18._4_4_;
      auVar203._8_4_ = fVar111 * auVar18._8_4_;
      auVar203._12_4_ = fVar113 * auVar18._12_4_;
      auVar17 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar17);
      auVar137 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar178);
      auVar17 = vblendps_avx(auVar137,local_4d0,8);
      auVar14 = vandps_avx(auVar14,local_2f0);
      auVar15 = vandps_avx(auVar15,local_2f0);
      auVar18 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vandps_avx(auVar16,local_2f0);
      auVar15 = vandps_avx(auVar17,local_2f0);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar18,auVar14);
      auVar15 = vmovshdup_avx(auVar14);
      auVar15 = vmaxss_avx(auVar15,auVar14);
      auVar14 = vshufpd_avx(auVar14,auVar14,1);
      auVar14 = vmaxss_avx(auVar14,auVar15);
      lVar23 = (long)iVar10 * 0x44;
      auVar15 = vmovshdup_avx(auVar19);
      uVar95 = auVar15._0_8_;
      local_420._8_8_ = uVar95;
      local_420._0_8_ = uVar95;
      local_420._16_8_ = uVar95;
      local_420._24_8_ = uVar95;
      auVar15 = vmovshdup_avx(auVar99);
      uVar95 = auVar15._0_8_;
      local_6e0._8_8_ = uVar95;
      local_6e0._0_8_ = uVar95;
      local_6e0._16_8_ = uVar95;
      local_6e0._24_8_ = uVar95;
      auVar7 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x908);
      local_6a0._0_16_ = auVar98;
      uVar198 = auVar98._0_4_;
      local_6c0._4_4_ = uVar198;
      local_6c0._0_4_ = uVar198;
      local_6c0._8_4_ = uVar198;
      local_6c0._12_4_ = uVar198;
      local_6c0._16_4_ = uVar198;
      local_6c0._20_4_ = uVar198;
      local_6c0._24_4_ = uVar198;
      local_6c0._28_4_ = uVar198;
      auVar15 = vmovshdup_avx(auVar98);
      uVar95 = auVar15._0_8_;
      local_5a0._8_8_ = uVar95;
      local_5a0._0_8_ = uVar95;
      local_5a0._16_8_ = uVar95;
      local_5a0._24_8_ = uVar95;
      fVar136 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar23 + 0xd8c);
      auVar84 = *(undefined1 (*) [28])(bezier_basis0 + lVar23 + 0xd8c);
      local_660 = auVar137._0_4_;
      auVar15 = vmovshdup_avx(auVar137);
      local_740 = auVar15._0_8_;
      auVar108._4_4_ = local_660 * *(float *)(bezier_basis0 + lVar23 + 0xd90);
      auVar108._0_4_ = local_660 * fVar136;
      auVar108._8_4_ = local_660 * *(float *)(bezier_basis0 + lVar23 + 0xd94);
      auVar108._12_4_ = local_660 * *(float *)(bezier_basis0 + lVar23 + 0xd98);
      auVar108._16_4_ = local_660 * *(float *)(bezier_basis0 + lVar23 + 0xd9c);
      auVar108._20_4_ = local_660 * *(float *)(bezier_basis0 + lVar23 + 0xda0);
      auVar108._24_4_ = local_660 * *(float *)(bezier_basis0 + lVar23 + 0xda4);
      auVar108._28_4_ = *(undefined4 *)(bezier_basis0 + lVar23 + 0xda8);
      auVar16 = vfmadd231ps_fma(auVar108,auVar7,local_6c0);
      fVar150 = auVar15._0_4_;
      auVar129._0_4_ = fVar150 * fVar136;
      fVar154 = auVar15._4_4_;
      auVar129._4_4_ = fVar154 * *(float *)(bezier_basis0 + lVar23 + 0xd90);
      auVar129._8_4_ = fVar150 * *(float *)(bezier_basis0 + lVar23 + 0xd94);
      auVar129._12_4_ = fVar154 * *(float *)(bezier_basis0 + lVar23 + 0xd98);
      auVar129._16_4_ = fVar150 * *(float *)(bezier_basis0 + lVar23 + 0xd9c);
      auVar129._20_4_ = fVar154 * *(float *)(bezier_basis0 + lVar23 + 0xda0);
      auVar129._24_4_ = fVar150 * *(float *)(bezier_basis0 + lVar23 + 0xda4);
      auVar129._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar129,auVar7,local_5a0);
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x484);
      uVar94 = auVar99._0_4_;
      local_760._4_4_ = uVar94;
      local_760._0_4_ = uVar94;
      local_760._8_4_ = uVar94;
      local_760._12_4_ = uVar94;
      local_760._16_4_ = uVar94;
      local_760._20_4_ = uVar94;
      local_760._24_4_ = uVar94;
      local_760._28_4_ = uVar94;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar108,local_760);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar108,local_6e0);
      auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar23);
      local_440._0_4_ = auVar19._0_4_;
      local_780._4_4_ = local_440._0_4_;
      local_780._0_4_ = local_440._0_4_;
      local_780._8_4_ = local_440._0_4_;
      local_780._12_4_ = local_440._0_4_;
      local_780._16_4_ = local_440._0_4_;
      local_780._20_4_ = local_440._0_4_;
      local_780._24_4_ = local_440._0_4_;
      local_780._28_4_ = local_440._0_4_;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar129,local_780);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar129,local_420);
      local_320 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x908);
      auVar174 = ZEXT3264(local_320);
      fVar110 = *(float *)(bezier_basis1 + lVar23 + 0xd8c);
      fVar112 = *(float *)(bezier_basis1 + lVar23 + 0xd90);
      fVar114 = *(float *)(bezier_basis1 + lVar23 + 0xd94);
      fVar115 = *(float *)(bezier_basis1 + lVar23 + 0xd98);
      fVar116 = *(float *)(bezier_basis1 + lVar23 + 0xd9c);
      fVar117 = *(float *)(bezier_basis1 + lVar23 + 0xda0);
      fVar197 = *(float *)(bezier_basis1 + lVar23 + 0xda4);
      auVar191._4_4_ = fVar112 * local_660;
      auVar191._0_4_ = fVar110 * local_660;
      auVar191._8_4_ = fVar114 * local_660;
      auVar191._12_4_ = fVar115 * local_660;
      auVar191._16_4_ = fVar116 * local_660;
      auVar191._20_4_ = fVar117 * local_660;
      auVar191._24_4_ = fVar197 * local_660;
      auVar191._28_4_ = *(undefined4 *)(bezier_basis0 + lVar23 + 0xda8);
      auVar17 = vfmadd231ps_fma(auVar191,local_320,local_6c0);
      auVar8._4_4_ = fVar112 * fVar154;
      auVar8._0_4_ = fVar110 * fVar150;
      auVar8._8_4_ = fVar114 * fVar150;
      auVar8._12_4_ = fVar115 * fVar154;
      auVar8._16_4_ = fVar116 * fVar150;
      auVar8._20_4_ = fVar117 * fVar154;
      auVar8._24_4_ = fVar197 * fVar150;
      auVar8._28_4_ = uVar198;
      auVar18 = vfmadd231ps_fma(auVar8,local_320,local_5a0);
      auVar191 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x484);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar191,local_760);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar191,local_6e0);
      auVar8 = *(undefined1 (*) [32])(bezier_basis1 + lVar23);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar8,local_780);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar8,local_420);
      auVar101 = ZEXT1632(auVar17);
      auVar124 = ZEXT1632(auVar16);
      auVar20 = vsubps_avx(auVar101,auVar124);
      auVar144 = ZEXT1632(auVar18);
      auVar208 = ZEXT1632(auVar15);
      auVar21 = vsubps_avx(auVar144,auVar208);
      auVar102._0_4_ = auVar15._0_4_ * auVar20._0_4_;
      auVar102._4_4_ = auVar15._4_4_ * auVar20._4_4_;
      auVar102._8_4_ = auVar15._8_4_ * auVar20._8_4_;
      auVar102._12_4_ = auVar15._12_4_ * auVar20._12_4_;
      auVar102._16_4_ = auVar20._16_4_ * 0.0;
      auVar102._20_4_ = auVar20._20_4_ * 0.0;
      auVar102._24_4_ = auVar20._24_4_ * 0.0;
      auVar102._28_4_ = 0;
      fVar136 = auVar21._0_4_;
      auVar125._0_4_ = auVar16._0_4_ * fVar136;
      fVar109 = auVar21._4_4_;
      auVar125._4_4_ = auVar16._4_4_ * fVar109;
      fVar111 = auVar21._8_4_;
      auVar125._8_4_ = auVar16._8_4_ * fVar111;
      fVar113 = auVar21._12_4_;
      auVar125._12_4_ = auVar16._12_4_ * fVar113;
      fVar195 = auVar21._16_4_;
      auVar125._16_4_ = fVar195 * 0.0;
      fVar196 = auVar21._20_4_;
      auVar125._20_4_ = fVar196 * 0.0;
      fVar135 = auVar21._24_4_;
      auVar125._24_4_ = fVar135 * 0.0;
      auVar125._28_4_ = 0;
      auVar102 = vsubps_avx(auVar102,auVar125);
      auVar15 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar95 = auVar15._0_8_;
      local_80._8_8_ = uVar95;
      local_80._0_8_ = uVar95;
      local_80._16_8_ = uVar95;
      local_80._24_8_ = uVar95;
      auVar16 = vpermilps_avx(local_4b0,0xff);
      uVar95 = auVar16._0_8_;
      local_a0._8_8_ = uVar95;
      local_a0._0_8_ = uVar95;
      local_a0._16_8_ = uVar95;
      local_a0._24_8_ = uVar95;
      auVar16 = vpermilps_avx(local_4c0,0xff);
      uVar95 = auVar16._0_8_;
      local_c0._8_8_ = uVar95;
      local_c0._0_8_ = uVar95;
      local_c0._16_8_ = uVar95;
      local_c0._24_8_ = uVar95;
      auVar16 = vpermilps_avx(local_4d0,0xff);
      local_e0 = auVar16._0_8_;
      local_840 = auVar84._0_4_;
      auStack_83c._0_4_ = auVar84._4_4_;
      auStack_83c._4_4_ = auVar84._8_4_;
      fStack_834 = auVar84._12_4_;
      fStack_830 = auVar84._16_4_;
      fStack_82c = auVar84._20_4_;
      fStack_828 = auVar84._24_4_;
      fVar118 = auVar16._0_4_;
      fVar134 = auVar16._4_4_;
      auVar147._4_4_ = fVar134 * (float)auStack_83c._0_4_;
      auVar147._0_4_ = fVar118 * (float)local_840;
      auVar147._8_4_ = fVar118 * (float)auStack_83c._4_4_;
      auVar147._12_4_ = fVar134 * fStack_834;
      auVar147._16_4_ = fVar118 * fStack_830;
      auVar147._20_4_ = fVar134 * fStack_82c;
      auVar147._24_4_ = fVar118 * fStack_828;
      auVar147._28_4_ = local_440._0_4_;
      auVar16 = vfmadd231ps_fma(auVar147,local_c0,auVar7);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar108,local_a0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar129,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar22._4_4_ = fVar112 * fVar134;
      auVar22._0_4_ = fVar110 * fVar118;
      auVar22._8_4_ = fVar114 * fVar118;
      auVar22._12_4_ = fVar115 * fVar134;
      auVar22._16_4_ = fVar116 * fVar118;
      auVar22._20_4_ = fVar117 * fVar134;
      auVar22._24_4_ = fVar197 * fVar118;
      auVar22._28_4_ = auVar129._28_4_;
      auVar17 = vfmadd231ps_fma(auVar22,local_320,local_c0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar191,local_a0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar8,local_80);
      auVar131._4_4_ = fVar109 * fVar109;
      auVar131._0_4_ = fVar136 * fVar136;
      auVar131._8_4_ = fVar111 * fVar111;
      auVar131._12_4_ = fVar113 * fVar113;
      auVar131._16_4_ = fVar195 * fVar195;
      auVar131._20_4_ = fVar196 * fVar196;
      auVar131._24_4_ = fVar135 * fVar135;
      auVar131._28_4_ = auVar15._4_4_;
      auVar15 = vfmadd231ps_fma(auVar131,auVar20,auVar20);
      auVar147 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
      auVar172._4_4_ = auVar147._4_4_ * auVar147._4_4_ * auVar15._4_4_;
      auVar172._0_4_ = auVar147._0_4_ * auVar147._0_4_ * auVar15._0_4_;
      auVar172._8_4_ = auVar147._8_4_ * auVar147._8_4_ * auVar15._8_4_;
      auVar172._12_4_ = auVar147._12_4_ * auVar147._12_4_ * auVar15._12_4_;
      auVar172._16_4_ = auVar147._16_4_ * auVar147._16_4_ * 0.0;
      auVar172._20_4_ = auVar147._20_4_ * auVar147._20_4_ * 0.0;
      auVar172._24_4_ = auVar147._24_4_ * auVar147._24_4_ * 0.0;
      auVar172._28_4_ = auVar147._28_4_;
      auVar187._4_4_ = auVar102._4_4_ * auVar102._4_4_;
      auVar187._0_4_ = auVar102._0_4_ * auVar102._0_4_;
      auVar187._8_4_ = auVar102._8_4_ * auVar102._8_4_;
      auVar187._12_4_ = auVar102._12_4_ * auVar102._12_4_;
      auVar187._16_4_ = auVar102._16_4_ * auVar102._16_4_;
      auVar187._20_4_ = auVar102._20_4_ * auVar102._20_4_;
      auVar187._24_4_ = auVar102._24_4_ * auVar102._24_4_;
      auVar187._28_4_ = auVar102._28_4_;
      auVar147 = vcmpps_avx(auVar187,auVar172,2);
      auVar149 = ZEXT3264(auVar147);
      fVar136 = auVar14._0_4_ * 4.7683716e-07;
      auVar103._0_4_ = (float)iVar10;
      register0x00001504 = auVar137._4_12_;
      auVar103._4_4_ = auVar103._0_4_;
      auVar103._8_4_ = auVar103._0_4_;
      auVar103._12_4_ = auVar103._0_4_;
      auVar103._16_4_ = auVar103._0_4_;
      auVar103._20_4_ = auVar103._0_4_;
      auVar103._24_4_ = auVar103._0_4_;
      auVar103._28_4_ = auVar103._0_4_;
      auVar102 = vcmpps_avx(_DAT_02020f40,auVar103,1);
      auVar15 = vpermilps_avx(auVar19,0xaa);
      uVar95 = auVar15._0_8_;
      local_600._8_8_ = uVar95;
      local_600._0_8_ = uVar95;
      local_600._16_8_ = uVar95;
      local_600._24_8_ = uVar95;
      auVar209 = ZEXT3264(local_600);
      auVar14 = vpermilps_avx(auVar99,0xaa);
      uVar95 = auVar14._0_8_;
      local_140._8_8_ = uVar95;
      local_140._0_8_ = uVar95;
      local_140._16_8_ = uVar95;
      local_140._24_8_ = uVar95;
      auVar14 = vpermilps_avx(auVar98,0xaa);
      uVar95 = auVar14._0_8_;
      local_440._8_8_ = uVar95;
      local_440._0_8_ = uVar95;
      local_440._16_8_ = uVar95;
      local_440._24_8_ = uVar95;
      auVar14 = vshufps_avx(auVar137,auVar137,0xaa);
      uVar95 = auVar14._0_8_;
      auVar22 = auVar102 & auVar147;
      uVar89 = *(uint *)(ray + k * 4 + 0x30);
      local_5c0._0_16_ = ZEXT416(uVar89);
      fVar109 = fVar150;
      fVar111 = fVar154;
      fVar113 = fVar150;
      fVar195 = fVar154;
      fVar196 = fVar150;
      uVar205 = uVar95;
      uStack_670 = uVar95;
      uStack_668 = uVar95;
      uStack_738 = local_740;
      uStack_730 = local_740;
      uStack_728 = local_740;
      fStack_65c = local_660;
      fStack_658 = local_660;
      fStack_654 = local_660;
      fStack_650 = local_660;
      fStack_64c = local_660;
      fStack_648 = local_660;
      fStack_644 = local_660;
      local_570._0_4_ = auVar103._0_4_;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0x7f,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0xbf,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f])
      {
        pRVar86 = (RTCIntersectArguments *)0x0;
        auVar202 = ZEXT3264(auVar130);
        auVar133 = ZEXT3264(local_6e0);
        auVar215 = ZEXT3264(local_6c0);
        auVar192 = ZEXT3264(local_5a0);
        auVar179 = ZEXT3264(CONCAT428(local_660,
                                      CONCAT424(local_660,
                                                CONCAT420(local_660,
                                                          CONCAT416(local_660,
                                                                    CONCAT412(local_660,
                                                                              CONCAT48(local_660,
                                                                                       CONCAT44(
                                                  local_660,local_660))))))));
        auVar194 = ZEXT3264(local_760);
        auVar216 = ZEXT3264(local_780);
      }
      else {
        local_480 = SUB84(pGVar11,0);
        fStack_47c = (float)((ulong)pGVar11 >> 0x20);
        local_6a0 = vandps_avx(auVar147,auVar102);
        fVar118 = auVar14._0_4_;
        fVar134 = auVar14._4_4_;
        auVar213._4_4_ = fVar134 * fVar112;
        auVar213._0_4_ = fVar118 * fVar110;
        auVar213._8_4_ = fVar118 * fVar114;
        auVar213._12_4_ = fVar134 * fVar115;
        auVar213._16_4_ = fVar118 * fVar116;
        auVar213._20_4_ = fVar134 * fVar117;
        auVar213._24_4_ = fVar118 * fVar197;
        auVar213._28_4_ = local_6a0._28_4_;
        auVar14 = vfmadd213ps_fma(local_320,local_440,auVar213);
        auVar14 = vfmadd213ps_fma(auVar191,local_140,ZEXT1632(auVar14));
        auVar14 = vfmadd213ps_fma(auVar8,local_600,ZEXT1632(auVar14));
        auVar104._0_4_ = fVar118 * (float)local_840;
        auVar104._4_4_ = fVar134 * (float)auStack_83c._0_4_;
        auVar104._8_4_ = fVar118 * (float)auStack_83c._4_4_;
        auVar104._12_4_ = fVar134 * fStack_834;
        auVar104._16_4_ = fVar118 * fStack_830;
        auVar104._20_4_ = fVar134 * fStack_82c;
        auVar104._24_4_ = fVar118 * fStack_828;
        auVar104._28_4_ = 0;
        auVar18 = vfmadd213ps_fma(auVar7,local_440,auVar104);
        auVar18 = vfmadd213ps_fma(auVar108,local_140,ZEXT1632(auVar18));
        auVar7 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1210);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1694);
        auVar191 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1b18);
        fVar135 = *(float *)(bezier_basis0 + lVar23 + 0x1f9c);
        fVar110 = *(float *)(bezier_basis0 + lVar23 + 0x1fa0);
        fVar112 = *(float *)(bezier_basis0 + lVar23 + 0x1fa4);
        fVar114 = *(float *)(bezier_basis0 + lVar23 + 0x1fa8);
        fVar115 = *(float *)(bezier_basis0 + lVar23 + 0x1fac);
        fVar116 = *(float *)(bezier_basis0 + lVar23 + 0x1fb0);
        fVar117 = *(float *)(bezier_basis0 + lVar23 + 0x1fb4);
        auVar25._4_4_ = local_660 * fVar110;
        auVar25._0_4_ = local_660 * fVar135;
        auVar25._8_4_ = local_660 * fVar112;
        auVar25._12_4_ = local_660 * fVar114;
        auVar25._16_4_ = local_660 * fVar115;
        auVar25._20_4_ = local_660 * fVar116;
        auVar25._24_4_ = local_660 * fVar117;
        auVar25._28_4_ = auVar21._28_4_;
        auVar26._4_4_ = fVar154 * fVar110;
        auVar26._0_4_ = fVar150 * fVar135;
        auVar26._8_4_ = fVar150 * fVar112;
        auVar26._12_4_ = fVar154 * fVar114;
        auVar26._16_4_ = fVar150 * fVar115;
        auVar26._20_4_ = fVar154 * fVar116;
        auVar26._24_4_ = fVar150 * fVar117;
        auVar26._28_4_ = *(undefined4 *)(bezier_basis1 + lVar23 + 0xda8);
        auVar27._4_4_ = fVar110 * fVar134;
        auVar27._0_4_ = fVar135 * fVar118;
        auVar27._8_4_ = fVar112 * fVar118;
        auVar27._12_4_ = fVar114 * fVar134;
        auVar27._16_4_ = fVar115 * fVar118;
        auVar27._20_4_ = fVar116 * fVar134;
        auVar27._24_4_ = fVar117 * fVar118;
        auVar27._28_4_ = auVar20._28_4_;
        auVar19 = vfmadd231ps_fma(auVar25,auVar191,local_6c0);
        auVar99 = vfmadd231ps_fma(auVar26,auVar191,local_5a0);
        auVar98 = vfmadd231ps_fma(auVar27,local_440,auVar191);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar108,local_760);
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar108,local_6e0);
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),local_140,auVar108);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar7,local_780);
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar7,local_420);
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),local_600,auVar7);
        fVar135 = *(float *)(bezier_basis1 + lVar23 + 0x1f9c);
        fVar110 = *(float *)(bezier_basis1 + lVar23 + 0x1fa0);
        fVar112 = *(float *)(bezier_basis1 + lVar23 + 0x1fa4);
        fVar114 = *(float *)(bezier_basis1 + lVar23 + 0x1fa8);
        fVar115 = *(float *)(bezier_basis1 + lVar23 + 0x1fac);
        fVar116 = *(float *)(bezier_basis1 + lVar23 + 0x1fb0);
        fVar117 = *(float *)(bezier_basis1 + lVar23 + 0x1fb4);
        auVar28._4_4_ = local_660 * fVar110;
        auVar28._0_4_ = local_660 * fVar135;
        auVar28._8_4_ = local_660 * fVar112;
        auVar28._12_4_ = local_660 * fVar114;
        auVar28._16_4_ = local_660 * fVar115;
        auVar28._20_4_ = local_660 * fVar116;
        auVar28._24_4_ = local_660 * fVar117;
        auVar28._28_4_ = local_660;
        auVar29._4_4_ = fVar154 * fVar110;
        auVar29._0_4_ = fVar150 * fVar135;
        auVar29._8_4_ = fVar150 * fVar112;
        auVar29._12_4_ = fVar154 * fVar114;
        auVar29._16_4_ = fVar150 * fVar115;
        auVar29._20_4_ = fVar154 * fVar116;
        auVar29._24_4_ = fVar150 * fVar117;
        auVar29._28_4_ = fVar154;
        auVar30._4_4_ = fVar110 * fVar134;
        auVar30._0_4_ = fVar135 * fVar118;
        auVar30._8_4_ = fVar112 * fVar118;
        auVar30._12_4_ = fVar114 * fVar134;
        auVar30._16_4_ = fVar115 * fVar118;
        auVar30._20_4_ = fVar116 * fVar134;
        auVar30._24_4_ = fVar117 * fVar118;
        auVar30._28_4_ = auVar15._4_4_;
        auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1b18);
        auVar15 = vfmadd231ps_fma(auVar28,auVar7,local_6c0);
        auVar137 = vfmadd231ps_fma(auVar29,auVar7,local_5a0);
        auVar120 = vfmadd231ps_fma(auVar30,auVar7,local_440);
        auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1694);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar7,local_760);
        auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar7,local_6e0);
        auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),local_140,auVar7);
        auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1210);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar7,local_780);
        auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar7,local_420);
        auVar126._8_4_ = 0x7fffffff;
        auVar126._0_8_ = 0x7fffffff7fffffff;
        auVar126._12_4_ = 0x7fffffff;
        auVar126._16_4_ = 0x7fffffff;
        auVar126._20_4_ = 0x7fffffff;
        auVar126._24_4_ = 0x7fffffff;
        auVar126._28_4_ = 0x7fffffff;
        auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),local_600,auVar7);
        auVar7 = vandps_avx(ZEXT1632(auVar19),auVar126);
        auVar108 = vandps_avx(ZEXT1632(auVar99),auVar126);
        auVar108 = vmaxps_avx(auVar7,auVar108);
        auVar7 = vandps_avx(ZEXT1632(auVar98),auVar126);
        auVar7 = vmaxps_avx(auVar108,auVar7);
        auVar145._4_4_ = fVar136;
        auVar145._0_4_ = fVar136;
        auVar145._8_4_ = fVar136;
        auVar145._12_4_ = fVar136;
        auVar145._16_4_ = fVar136;
        auVar145._20_4_ = fVar136;
        auVar145._24_4_ = fVar136;
        auVar145._28_4_ = fVar136;
        auVar7 = vcmpps_avx(auVar7,auVar145,1);
        auVar191 = vblendvps_avx(ZEXT1632(auVar19),auVar20,auVar7);
        auVar8 = vblendvps_avx(ZEXT1632(auVar99),auVar21,auVar7);
        auVar7 = vandps_avx(ZEXT1632(auVar15),auVar126);
        auVar108 = vandps_avx(ZEXT1632(auVar137),auVar126);
        auVar147 = vmaxps_avx(auVar7,auVar108);
        auVar7 = vandps_avx(ZEXT1632(auVar120),auVar126);
        auVar7 = vmaxps_avx(auVar147,auVar7);
        auVar102 = vcmpps_avx(auVar7,auVar145,1);
        auVar7 = vblendvps_avx(ZEXT1632(auVar15),auVar20,auVar102);
        auVar147 = vblendvps_avx(ZEXT1632(auVar137),auVar21,auVar102);
        auVar15 = vfmadd213ps_fma(auVar129,local_600,ZEXT1632(auVar18));
        auVar18 = vfmadd213ps_fma(auVar191,auVar191,ZEXT832(0) << 0x20);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar8,auVar8);
        auVar129 = vrsqrtps_avx(ZEXT1632(auVar18));
        fVar135 = auVar129._0_4_;
        fVar110 = auVar129._4_4_;
        fVar112 = auVar129._8_4_;
        fVar114 = auVar129._12_4_;
        fVar115 = auVar129._16_4_;
        fVar116 = auVar129._20_4_;
        fVar117 = auVar129._24_4_;
        auVar20._4_4_ = fVar110 * fVar110 * fVar110 * auVar18._4_4_ * -0.5;
        auVar20._0_4_ = fVar135 * fVar135 * fVar135 * auVar18._0_4_ * -0.5;
        auVar20._8_4_ = fVar112 * fVar112 * fVar112 * auVar18._8_4_ * -0.5;
        auVar20._12_4_ = fVar114 * fVar114 * fVar114 * auVar18._12_4_ * -0.5;
        auVar20._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar20._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar20._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar20._28_4_ = 0;
        auVar160._8_4_ = 0x3fc00000;
        auVar160._0_8_ = 0x3fc000003fc00000;
        auVar160._12_4_ = 0x3fc00000;
        auVar160._16_4_ = 0x3fc00000;
        auVar160._20_4_ = 0x3fc00000;
        auVar160._24_4_ = 0x3fc00000;
        auVar160._28_4_ = 0x3fc00000;
        auVar18 = vfmadd231ps_fma(auVar20,auVar160,auVar129);
        fVar135 = auVar18._0_4_;
        fVar110 = auVar18._4_4_;
        auVar31._4_4_ = auVar8._4_4_ * fVar110;
        auVar31._0_4_ = auVar8._0_4_ * fVar135;
        fVar112 = auVar18._8_4_;
        auVar31._8_4_ = auVar8._8_4_ * fVar112;
        fVar114 = auVar18._12_4_;
        auVar31._12_4_ = auVar8._12_4_ * fVar114;
        auVar31._16_4_ = auVar8._16_4_ * 0.0;
        auVar31._20_4_ = auVar8._20_4_ * 0.0;
        auVar31._24_4_ = auVar8._24_4_ * 0.0;
        auVar31._28_4_ = auVar129._28_4_;
        auVar32._4_4_ = -auVar191._4_4_ * fVar110;
        auVar32._0_4_ = -auVar191._0_4_ * fVar135;
        auVar32._8_4_ = -auVar191._8_4_ * fVar112;
        auVar32._12_4_ = -auVar191._12_4_ * fVar114;
        auVar32._16_4_ = -auVar191._16_4_ * 0.0;
        auVar32._20_4_ = -auVar191._20_4_ * 0.0;
        auVar32._24_4_ = -auVar191._24_4_ * 0.0;
        auVar32._28_4_ = auVar108._28_4_;
        auVar18 = vfmadd213ps_fma(auVar7,auVar7,ZEXT832(0) << 0x20);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar147,auVar147);
        auVar108 = vrsqrtps_avx(ZEXT1632(auVar18));
        auVar33._28_4_ = auVar102._28_4_;
        auVar33._0_28_ =
             ZEXT1628(CONCAT412(fVar114 * 0.0,
                                CONCAT48(fVar112 * 0.0,CONCAT44(fVar110 * 0.0,fVar135 * 0.0))));
        fVar135 = auVar108._0_4_;
        fVar110 = auVar108._4_4_;
        fVar112 = auVar108._8_4_;
        fVar114 = auVar108._12_4_;
        fVar115 = auVar108._16_4_;
        fVar116 = auVar108._20_4_;
        fVar117 = auVar108._24_4_;
        auVar34._4_4_ = fVar110 * fVar110 * fVar110 * auVar18._4_4_ * -0.5;
        auVar34._0_4_ = fVar135 * fVar135 * fVar135 * auVar18._0_4_ * -0.5;
        auVar34._8_4_ = fVar112 * fVar112 * fVar112 * auVar18._8_4_ * -0.5;
        auVar34._12_4_ = fVar114 * fVar114 * fVar114 * auVar18._12_4_ * -0.5;
        auVar34._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar34._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar34._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar34._28_4_ = 0;
        auVar18 = vfmadd231ps_fma(auVar34,auVar160,auVar108);
        fVar135 = auVar18._0_4_;
        fVar110 = auVar18._4_4_;
        auVar35._4_4_ = auVar147._4_4_ * fVar110;
        auVar35._0_4_ = auVar147._0_4_ * fVar135;
        fVar112 = auVar18._8_4_;
        auVar35._8_4_ = auVar147._8_4_ * fVar112;
        fVar114 = auVar18._12_4_;
        auVar35._12_4_ = auVar147._12_4_ * fVar114;
        auVar35._16_4_ = auVar147._16_4_ * 0.0;
        auVar35._20_4_ = auVar147._20_4_ * 0.0;
        auVar35._24_4_ = auVar147._24_4_ * 0.0;
        auVar35._28_4_ = 0;
        auVar36._4_4_ = -auVar7._4_4_ * fVar110;
        auVar36._0_4_ = -auVar7._0_4_ * fVar135;
        auVar36._8_4_ = -auVar7._8_4_ * fVar112;
        auVar36._12_4_ = -auVar7._12_4_ * fVar114;
        auVar36._16_4_ = -auVar7._16_4_ * 0.0;
        auVar36._20_4_ = -auVar7._20_4_ * 0.0;
        auVar36._24_4_ = -auVar7._24_4_ * 0.0;
        auVar36._28_4_ = auVar147._28_4_;
        auVar7._28_4_ = auVar108._28_4_;
        auVar7._0_28_ =
             ZEXT1628(CONCAT412(fVar114 * 0.0,
                                CONCAT48(fVar112 * 0.0,CONCAT44(fVar110 * 0.0,fVar135 * 0.0))));
        auVar18 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar16),auVar124);
        auVar108 = ZEXT1632(auVar16);
        auVar19 = vfmadd213ps_fma(auVar32,auVar108,auVar208);
        auVar99 = vfmadd213ps_fma(auVar33,auVar108,ZEXT1632(auVar15));
        auVar120 = vfnmadd213ps_fma(auVar31,auVar108,auVar124);
        auVar98 = vfmadd213ps_fma(auVar35,ZEXT1632(auVar17),auVar101);
        auVar97 = vfnmadd213ps_fma(auVar32,auVar108,auVar208);
        auVar108 = ZEXT1632(auVar17);
        auVar137 = vfmadd213ps_fma(auVar36,auVar108,auVar144);
        auVar213 = ZEXT1632(auVar16);
        auVar156 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar213,auVar33);
        auVar15 = vfmadd213ps_fma(auVar7,auVar108,ZEXT1632(auVar14));
        auVar121 = vfnmadd213ps_fma(auVar35,auVar108,auVar101);
        auVar151 = vfnmadd213ps_fma(auVar36,auVar108,auVar144);
        auVar96 = vfnmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar17),auVar7);
        auVar7 = vsubps_avx(ZEXT1632(auVar137),ZEXT1632(auVar97));
        auVar108 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar156));
        auVar101._4_4_ = auVar156._4_4_ * auVar7._4_4_;
        auVar101._0_4_ = auVar156._0_4_ * auVar7._0_4_;
        auVar101._8_4_ = auVar156._8_4_ * auVar7._8_4_;
        auVar101._12_4_ = auVar156._12_4_ * auVar7._12_4_;
        auVar101._16_4_ = auVar7._16_4_ * 0.0;
        auVar101._20_4_ = auVar7._20_4_ * 0.0;
        auVar101._24_4_ = auVar7._24_4_ * 0.0;
        auVar101._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar97),auVar108);
        auVar124._4_4_ = auVar120._4_4_ * auVar108._4_4_;
        auVar124._0_4_ = auVar120._0_4_ * auVar108._0_4_;
        auVar124._8_4_ = auVar120._8_4_ * auVar108._8_4_;
        auVar124._12_4_ = auVar120._12_4_ * auVar108._12_4_;
        auVar124._16_4_ = auVar108._16_4_ * 0.0;
        auVar124._20_4_ = auVar108._20_4_ * 0.0;
        auVar124._24_4_ = auVar108._24_4_ * 0.0;
        auVar124._28_4_ = auVar108._28_4_;
        auVar102 = ZEXT1632(auVar120);
        auVar108 = vsubps_avx(ZEXT1632(auVar98),auVar102);
        auVar14 = vfmsub231ps_fma(auVar124,ZEXT1632(auVar156),auVar108);
        auVar144._4_4_ = auVar97._4_4_ * auVar108._4_4_;
        auVar144._0_4_ = auVar97._0_4_ * auVar108._0_4_;
        auVar144._8_4_ = auVar97._8_4_ * auVar108._8_4_;
        auVar144._12_4_ = auVar97._12_4_ * auVar108._12_4_;
        auVar144._16_4_ = auVar108._16_4_ * 0.0;
        auVar144._20_4_ = auVar108._20_4_ * 0.0;
        auVar144._24_4_ = auVar108._24_4_ * 0.0;
        auVar144._28_4_ = auVar108._28_4_;
        auVar120 = vfmsub231ps_fma(auVar144,auVar102,auVar7);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar120),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar131 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
        auVar7 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar18),auVar131);
        auVar108 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar19),auVar131);
        auVar129 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar99),auVar131);
        auVar174 = ZEXT3264(auVar129);
        auVar191 = vblendvps_avx(auVar102,ZEXT1632(auVar98),auVar131);
        auVar8 = vblendvps_avx(ZEXT1632(auVar97),ZEXT1632(auVar137),auVar131);
        auVar147 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar15),auVar131);
        auVar102 = vblendvps_avx(ZEXT1632(auVar98),auVar102,auVar131);
        auVar20 = vblendvps_avx(ZEXT1632(auVar137),ZEXT1632(auVar97),auVar131);
        auVar14 = vpackssdw_avx(local_6a0._0_16_,local_6a0._16_16_);
        auVar22 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar156),auVar131);
        auVar172 = vsubps_avx(auVar102,auVar7);
        auVar20 = vsubps_avx(auVar20,auVar108);
        auVar187 = vsubps_avx(auVar22,auVar129);
        auVar101 = vsubps_avx(auVar7,auVar191);
        auVar124 = vsubps_avx(auVar108,auVar8);
        auVar125 = vsubps_avx(auVar129,auVar147);
        auVar208._4_4_ = auVar187._4_4_ * auVar7._4_4_;
        auVar208._0_4_ = auVar187._0_4_ * auVar7._0_4_;
        auVar208._8_4_ = auVar187._8_4_ * auVar7._8_4_;
        auVar208._12_4_ = auVar187._12_4_ * auVar7._12_4_;
        auVar208._16_4_ = auVar187._16_4_ * auVar7._16_4_;
        auVar208._20_4_ = auVar187._20_4_ * auVar7._20_4_;
        auVar208._24_4_ = auVar187._24_4_ * auVar7._24_4_;
        auVar208._28_4_ = auVar22._28_4_;
        auVar15 = vfmsub231ps_fma(auVar208,auVar129,auVar172);
        auVar37._4_4_ = auVar172._4_4_ * auVar108._4_4_;
        auVar37._0_4_ = auVar172._0_4_ * auVar108._0_4_;
        auVar37._8_4_ = auVar172._8_4_ * auVar108._8_4_;
        auVar37._12_4_ = auVar172._12_4_ * auVar108._12_4_;
        auVar37._16_4_ = auVar172._16_4_ * auVar108._16_4_;
        auVar37._20_4_ = auVar172._20_4_ * auVar108._20_4_;
        auVar37._24_4_ = auVar172._24_4_ * auVar108._24_4_;
        auVar37._28_4_ = auVar102._28_4_;
        auVar16 = vfmsub231ps_fma(auVar37,auVar7,auVar20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar105._0_4_ = auVar20._0_4_ * auVar129._0_4_;
        auVar105._4_4_ = auVar20._4_4_ * auVar129._4_4_;
        auVar105._8_4_ = auVar20._8_4_ * auVar129._8_4_;
        auVar105._12_4_ = auVar20._12_4_ * auVar129._12_4_;
        auVar105._16_4_ = auVar20._16_4_ * auVar129._16_4_;
        auVar105._20_4_ = auVar20._20_4_ * auVar129._20_4_;
        auVar105._24_4_ = auVar20._24_4_ * auVar129._24_4_;
        auVar105._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar105,auVar108,auVar187);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar149 = ZEXT1664(auVar16);
        auVar106._0_4_ = auVar125._0_4_ * auVar191._0_4_;
        auVar106._4_4_ = auVar125._4_4_ * auVar191._4_4_;
        auVar106._8_4_ = auVar125._8_4_ * auVar191._8_4_;
        auVar106._12_4_ = auVar125._12_4_ * auVar191._12_4_;
        auVar106._16_4_ = auVar125._16_4_ * auVar191._16_4_;
        auVar106._20_4_ = auVar125._20_4_ * auVar191._20_4_;
        auVar106._24_4_ = auVar125._24_4_ * auVar191._24_4_;
        auVar106._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar106,auVar101,auVar147);
        auVar38._4_4_ = auVar124._4_4_ * auVar147._4_4_;
        auVar38._0_4_ = auVar124._0_4_ * auVar147._0_4_;
        auVar38._8_4_ = auVar124._8_4_ * auVar147._8_4_;
        auVar38._12_4_ = auVar124._12_4_ * auVar147._12_4_;
        auVar38._16_4_ = auVar124._16_4_ * auVar147._16_4_;
        auVar38._20_4_ = auVar124._20_4_ * auVar147._20_4_;
        auVar38._24_4_ = auVar124._24_4_ * auVar147._24_4_;
        auVar38._28_4_ = auVar147._28_4_;
        auVar18 = vfmsub231ps_fma(auVar38,auVar8,auVar125);
        auVar39._4_4_ = auVar101._4_4_ * auVar8._4_4_;
        auVar39._0_4_ = auVar101._0_4_ * auVar8._0_4_;
        auVar39._8_4_ = auVar101._8_4_ * auVar8._8_4_;
        auVar39._12_4_ = auVar101._12_4_ * auVar8._12_4_;
        auVar39._16_4_ = auVar101._16_4_ * auVar8._16_4_;
        auVar39._20_4_ = auVar101._20_4_ * auVar8._20_4_;
        auVar39._24_4_ = auVar101._24_4_ * auVar8._24_4_;
        auVar39._28_4_ = auVar8._28_4_;
        auVar19 = vfmsub231ps_fma(auVar39,auVar124,auVar191);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar191 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar18));
        auVar191 = vcmpps_avx(auVar191,ZEXT832(0) << 0x20,2);
        auVar15 = vpackssdw_avx(auVar191._0_16_,auVar191._16_16_);
        auVar14 = vpand_avx(auVar14,auVar15);
        auVar191 = vpmovsxwd_avx2(auVar14);
        if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar191 >> 0x7f,0) == '\0') &&
              (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar191 >> 0xbf,0) == '\0') &&
            (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar191[0x1f]) {
LAB_0164bd68:
          auVar179 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar202 = ZEXT3264(auVar130);
        }
        else {
          auVar40._4_4_ = auVar20._4_4_ * auVar125._4_4_;
          auVar40._0_4_ = auVar20._0_4_ * auVar125._0_4_;
          auVar40._8_4_ = auVar20._8_4_ * auVar125._8_4_;
          auVar40._12_4_ = auVar20._12_4_ * auVar125._12_4_;
          auVar40._16_4_ = auVar20._16_4_ * auVar125._16_4_;
          auVar40._20_4_ = auVar20._20_4_ * auVar125._20_4_;
          auVar40._24_4_ = auVar20._24_4_ * auVar125._24_4_;
          auVar40._28_4_ = auVar191._28_4_;
          auVar98 = vfmsub231ps_fma(auVar40,auVar124,auVar187);
          auVar127._0_4_ = auVar101._0_4_ * auVar187._0_4_;
          auVar127._4_4_ = auVar101._4_4_ * auVar187._4_4_;
          auVar127._8_4_ = auVar101._8_4_ * auVar187._8_4_;
          auVar127._12_4_ = auVar101._12_4_ * auVar187._12_4_;
          auVar127._16_4_ = auVar101._16_4_ * auVar187._16_4_;
          auVar127._20_4_ = auVar101._20_4_ * auVar187._20_4_;
          auVar127._24_4_ = auVar101._24_4_ * auVar187._24_4_;
          auVar127._28_4_ = 0;
          auVar99 = vfmsub231ps_fma(auVar127,auVar172,auVar125);
          auVar41._4_4_ = auVar172._4_4_ * auVar124._4_4_;
          auVar41._0_4_ = auVar172._0_4_ * auVar124._0_4_;
          auVar41._8_4_ = auVar172._8_4_ * auVar124._8_4_;
          auVar41._12_4_ = auVar172._12_4_ * auVar124._12_4_;
          auVar41._16_4_ = auVar172._16_4_ * auVar124._16_4_;
          auVar41._20_4_ = auVar172._20_4_ * auVar124._20_4_;
          auVar41._24_4_ = auVar172._24_4_ * auVar124._24_4_;
          auVar41._28_4_ = auVar172._28_4_;
          auVar137 = vfmsub231ps_fma(auVar41,auVar101,auVar20);
          auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar137));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar98),_DAT_02020f00);
          auVar191 = vrcpps_avx(ZEXT1632(auVar19));
          auVar201._8_4_ = 0x3f800000;
          auVar201._0_8_ = &DAT_3f8000003f800000;
          auVar201._12_4_ = 0x3f800000;
          auVar201._16_4_ = 0x3f800000;
          auVar201._20_4_ = 0x3f800000;
          auVar201._24_4_ = 0x3f800000;
          auVar201._28_4_ = 0x3f800000;
          auVar15 = vfnmadd213ps_fma(auVar191,ZEXT1632(auVar19),auVar201);
          auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar191,auVar191);
          auVar42._4_4_ = auVar137._4_4_ * auVar129._4_4_;
          auVar42._0_4_ = auVar137._0_4_ * auVar129._0_4_;
          auVar42._8_4_ = auVar137._8_4_ * auVar129._8_4_;
          auVar42._12_4_ = auVar137._12_4_ * auVar129._12_4_;
          auVar42._16_4_ = auVar129._16_4_ * 0.0;
          auVar42._20_4_ = auVar129._20_4_ * 0.0;
          auVar42._24_4_ = auVar129._24_4_ * 0.0;
          auVar42._28_4_ = auVar129._28_4_;
          auVar99 = vfmadd231ps_fma(auVar42,auVar108,ZEXT1632(auVar99));
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT1632(auVar98),auVar7);
          auVar174 = ZEXT1664(auVar99);
          fVar135 = auVar15._0_4_;
          fVar110 = auVar15._4_4_;
          fVar112 = auVar15._8_4_;
          fVar114 = auVar15._12_4_;
          auVar43._28_4_ = auVar108._28_4_;
          auVar43._0_28_ =
               ZEXT1628(CONCAT412(fVar114 * auVar99._12_4_,
                                  CONCAT48(fVar112 * auVar99._8_4_,
                                           CONCAT44(fVar110 * auVar99._4_4_,fVar135 * auVar99._0_4_)
                                          )));
          auVar107._4_4_ = uVar89;
          auVar107._0_4_ = uVar89;
          auVar107._8_4_ = uVar89;
          auVar107._12_4_ = uVar89;
          auVar107._16_4_ = uVar89;
          auVar107._20_4_ = uVar89;
          auVar107._24_4_ = uVar89;
          auVar107._28_4_ = uVar89;
          uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar128._4_4_ = uVar94;
          auVar128._0_4_ = uVar94;
          auVar128._8_4_ = uVar94;
          auVar128._12_4_ = uVar94;
          auVar128._16_4_ = uVar94;
          auVar128._20_4_ = uVar94;
          auVar128._24_4_ = uVar94;
          auVar128._28_4_ = uVar94;
          auVar7 = vcmpps_avx(auVar107,auVar43,2);
          auVar108 = vcmpps_avx(auVar43,auVar128,2);
          auVar7 = vandps_avx(auVar108,auVar7);
          auVar15 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
          auVar14 = vpand_avx(auVar14,auVar15);
          auVar7 = vpmovsxwd_avx2(auVar14);
          if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar7 >> 0x7f,0) == '\0') &&
                (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar7 >> 0xbf,0) == '\0') &&
              (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar7[0x1f]) goto LAB_0164bd68;
          auVar7 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,4);
          auVar15 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
          auVar14 = vpand_avx(auVar14,auVar15);
          auVar7 = vpmovsxwd_avx2(auVar14);
          auVar174 = ZEXT3264(auVar7);
          auVar179 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar202 = ZEXT3264(auVar130);
          if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar7 >> 0x7f,0) != '\0') ||
                (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar7 >> 0xbf,0) != '\0') ||
              (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar7[0x1f] < '\0') {
            auVar108 = ZEXT1632(CONCAT412(fVar114 * auVar16._12_4_,
                                          CONCAT48(fVar112 * auVar16._8_4_,
                                                   CONCAT44(fVar110 * auVar16._4_4_,
                                                            fVar135 * auVar16._0_4_))));
            auVar129 = ZEXT1632(CONCAT412(fVar114 * auVar18._12_4_,
                                          CONCAT48(fVar112 * auVar18._8_4_,
                                                   CONCAT44(fVar110 * auVar18._4_4_,
                                                            fVar135 * auVar18._0_4_))));
            auVar161._8_4_ = 0x3f800000;
            auVar161._0_8_ = &DAT_3f8000003f800000;
            auVar161._12_4_ = 0x3f800000;
            auVar161._16_4_ = 0x3f800000;
            auVar161._20_4_ = 0x3f800000;
            auVar161._24_4_ = 0x3f800000;
            auVar161._28_4_ = 0x3f800000;
            auVar130 = vsubps_avx(auVar161,auVar108);
            auVar149 = ZEXT3264(auVar130);
            _local_160 = vblendvps_avx(auVar130,auVar108,auVar131);
            auVar130 = vsubps_avx(auVar161,auVar129);
            local_340 = vblendvps_avx(auVar130,auVar129,auVar131);
            auVar179 = ZEXT3264(auVar7);
            auVar202 = ZEXT3264(auVar43);
          }
        }
        auVar216 = ZEXT3264(local_780);
        auVar215 = ZEXT3264(local_6c0);
        auVar209 = ZEXT3264(local_600);
        auVar194 = ZEXT3264(local_760);
        auVar192 = ZEXT3264(local_5a0);
        auVar130 = auVar179._0_32_;
        if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar130 >> 0x7f,0) == '\0') &&
              (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar130 >> 0xbf,0) == '\0') &&
            (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar179[0x1f]) {
          pRVar86 = (RTCIntersectArguments *)0x0;
          auVar133 = ZEXT3264(local_6e0);
          auVar179 = ZEXT3264(CONCAT428(local_660,
                                        CONCAT424(local_660,
                                                  CONCAT420(local_660,
                                                            CONCAT416(local_660,
                                                                      CONCAT412(local_660,
                                                                                CONCAT48(local_660,
                                                                                         CONCAT44(
                                                  local_660,local_660))))))));
        }
        else {
          auVar7 = vsubps_avx(ZEXT1632(auVar17),auVar213);
          auVar14 = vfmadd213ps_fma(auVar7,_local_160,auVar213);
          fVar135 = *(float *)((long)local_638->ray_space + k * 4 + -0x10);
          auVar44._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar135;
          auVar44._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar135;
          auVar44._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar135;
          auVar44._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar135;
          auVar44._16_4_ = fVar135 * 0.0;
          auVar44._20_4_ = fVar135 * 0.0;
          auVar44._24_4_ = fVar135 * 0.0;
          auVar44._28_4_ = 0;
          local_700 = auVar202._0_32_;
          auVar7 = vcmpps_avx(local_700,auVar44,6);
          auVar108 = auVar130 & auVar7;
          auVar179 = ZEXT3264(CONCAT428(local_660,
                                        CONCAT424(local_660,
                                                  CONCAT420(local_660,
                                                            CONCAT416(local_660,
                                                                      CONCAT412(local_660,
                                                                                CONCAT48(local_660,
                                                                                         CONCAT44(
                                                  local_660,local_660))))))));
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar108 >> 0x7f,0) == '\0') &&
                (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar108 >> 0xbf,0) == '\0') &&
              (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar108[0x1f]) {
            pRVar86 = (RTCIntersectArguments *)0x0;
            auVar133 = ZEXT3264(local_6e0);
          }
          else {
            local_220 = vandps_avx(auVar7,auVar130);
            auVar130._8_4_ = 0xbf800000;
            auVar130._0_8_ = 0xbf800000bf800000;
            auVar130._12_4_ = 0xbf800000;
            auVar130._16_4_ = 0xbf800000;
            auVar130._20_4_ = 0xbf800000;
            auVar130._24_4_ = 0xbf800000;
            auVar130._28_4_ = 0xbf800000;
            auVar146._8_4_ = 0x40000000;
            auVar146._0_8_ = 0x4000000040000000;
            auVar146._12_4_ = 0x40000000;
            auVar146._16_4_ = 0x40000000;
            auVar146._20_4_ = 0x40000000;
            auVar146._24_4_ = 0x40000000;
            auVar146._28_4_ = 0x40000000;
            auVar14 = vfmadd213ps_fma(local_340,auVar146,auVar130);
            local_2e0 = _local_160;
            local_2c0 = ZEXT1632(auVar14);
            local_280 = 0;
            local_260 = local_4b0._0_8_;
            uStack_258 = local_4b0._8_8_;
            local_250 = local_4c0._0_8_;
            uStack_248 = local_4c0._8_8_;
            auVar149 = ZEXT1664(local_4d0);
            local_340 = local_2c0;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              pRVar86 = (RTCIntersectArguments *)0x0;
            }
            else {
              pRVar86 = context->args;
              if ((pRVar86->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar86 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar86 >> 8),1),
                 pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar135 = 1.0 / auVar103._0_4_;
                auVar149 = ZEXT3264(CONCAT428(fVar135,CONCAT424(fVar135,CONCAT420(fVar135,CONCAT416(
                                                  fVar135,CONCAT412(fVar135,CONCAT48(fVar135,
                                                  CONCAT44(fVar135,fVar135))))))));
                local_200[0] = fVar135 * ((float)local_160._0_4_ + 0.0);
                local_200[1] = fVar135 * ((float)local_160._4_4_ + 1.0);
                local_200[2] = fVar135 * (fStack_158 + 2.0);
                local_200[3] = fVar135 * (fStack_154 + 3.0);
                fStack_1f0 = fVar135 * (fStack_150 + 4.0);
                fStack_1ec = fVar135 * (fStack_14c + 5.0);
                fStack_1e8 = fVar135 * (fStack_148 + 6.0);
                fStack_1e4 = fStack_144 + 7.0;
                local_340._0_8_ = auVar14._0_8_;
                local_340._8_8_ = auVar14._8_8_;
                local_1e0 = local_340._0_8_;
                uStack_1d8 = local_340._8_8_;
                uStack_1d0 = 0;
                uStack_1c8 = 0;
                local_1c0 = local_700;
                uVar89 = vmovmskps_avx(local_220);
                local_6a0._0_4_ = (int)CONCAT71((int7)((ulong)pRVar86 >> 8),uVar89 != 0);
                uVar206 = uVar95;
                uVar207 = uVar95;
                if (uVar89 != 0) {
                  _local_840 = 0;
                  uVar90 = (ulong)(uVar89 & 0xff);
                  for (uVar85 = uVar90; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000
                      ) {
                    _local_840 = _local_840 + 1;
                  }
                  local_5e0._0_8_ = CONCAT44(uVar87,uVar87);
                  local_5e0._0_16_ = CONCAT412(uVar87,CONCAT48(uVar87,local_5e0._0_8_));
                  local_5e0 = ZEXT1632(local_5e0._0_16_);
                  local_500._0_8_ = CONCAT44(local_580,local_580);
                  local_500._0_16_ = CONCAT412(local_580,CONCAT48(local_580,local_500._0_8_));
                  local_500 = ZEXT1632(local_500._0_16_);
                  local_520 = ZEXT1632(local_4b0);
                  local_460 = ZEXT1632(local_4c0);
                  _local_560 = ZEXT1632(local_4d0);
                  auStack_530 = auVar21._16_16_;
                  local_540 = *local_640;
                  local_2a0 = local_700;
                  local_27c = iVar10;
                  local_270 = local_710;
                  uStack_268 = uStack_708;
                  local_240 = local_4d0;
                  local_680 = uVar95;
                  uStack_678 = uVar95;
                  do {
                    uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_3c0 = local_200[_local_840];
                    local_3b0 = *(undefined4 *)((long)&local_1e0 + _local_840 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_1c0 + _local_840 * 4);
                    fVar113 = 1.0 - local_3c0;
                    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar113 * fVar113)),
                                              ZEXT416((uint)(local_3c0 * fVar113)),
                                              ZEXT416(0xc0000000));
                    auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_3c0 * fVar113)),
                                              ZEXT416((uint)(local_3c0 * local_3c0)),
                                              ZEXT416(0x40000000));
                    auVar174 = ZEXT464(0x40400000);
                    fVar109 = auVar14._0_4_ * 3.0;
                    fVar111 = local_3c0 * local_3c0 * 3.0;
                    auVar165._0_4_ = fVar111 * (float)local_560._0_4_;
                    auVar165._4_4_ = fVar111 * (float)local_560._4_4_;
                    auVar165._8_4_ = fVar111 * fStack_558;
                    auVar165._12_4_ = fVar111 * fStack_554;
                    auVar138._4_4_ = fVar109;
                    auVar138._0_4_ = fVar109;
                    auVar138._8_4_ = fVar109;
                    auVar138._12_4_ = fVar109;
                    auVar14 = vfmadd132ps_fma(auVar138,auVar165,local_460._0_16_);
                    fVar109 = auVar15._0_4_ * 3.0;
                    auVar158._4_4_ = fVar109;
                    auVar158._0_4_ = fVar109;
                    auVar158._8_4_ = fVar109;
                    auVar158._12_4_ = fVar109;
                    auVar14 = vfmadd132ps_fma(auVar158,auVar14,local_520._0_16_);
                    fVar109 = fVar113 * fVar113 * -3.0;
                    local_630.context = context->user;
                    auVar139._4_4_ = fVar109;
                    auVar139._0_4_ = fVar109;
                    auVar139._8_4_ = fVar109;
                    auVar139._12_4_ = fVar109;
                    auVar79._8_8_ = uStack_708;
                    auVar79._0_8_ = local_710;
                    auVar14 = vfmadd132ps_fma(auVar139,auVar14,auVar79);
                    local_3f0 = auVar14._0_4_;
                    local_3e0 = vshufps_avx(auVar14,auVar14,0x55);
                    local_3d0 = vshufps_avx(auVar14,auVar14,0xaa);
                    auVar149 = ZEXT1664(local_3d0);
                    local_3a0 = local_500._0_8_;
                    uStack_398 = local_500._8_8_;
                    local_390 = local_5e0._0_16_;
                    vpcmpeqd_avx2(ZEXT1632(local_5e0._0_16_),ZEXT1632(local_5e0._0_16_));
                    uStack_37c = (local_630.context)->instID[0];
                    local_380 = uStack_37c;
                    uStack_378 = uStack_37c;
                    uStack_374 = uStack_37c;
                    uStack_370 = (local_630.context)->instPrimID[0];
                    uStack_36c = uStack_370;
                    uStack_368 = uStack_370;
                    uStack_364 = uStack_370;
                    local_7a0 = local_540._0_8_;
                    uStack_798 = local_540._8_8_;
                    local_630.valid = (int *)&local_7a0;
                    local_630.geometryUserPtr = *(void **)(CONCAT44(fStack_47c,local_480) + 0x18);
                    local_630.hit = (RTCHitN *)&local_3f0;
                    local_630.N = 4;
                    pcVar12 = *(code **)(CONCAT44(fStack_47c,local_480) + 0x48);
                    local_630.ray = (RTCRayN *)ray;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    fStack_3bc = local_3c0;
                    fStack_3b8 = local_3c0;
                    fStack_3b4 = local_3c0;
                    uStack_3ac = local_3b0;
                    uStack_3a8 = local_3b0;
                    uStack_3a4 = local_3b0;
                    if (pcVar12 != (code *)0x0) {
                      auVar149 = ZEXT1664(local_3d0);
                      auVar174 = ZEXT1664(auVar174._0_16_);
                      (*pcVar12)(&local_630);
                      auVar209 = ZEXT3264(local_600);
                      auVar216 = ZEXT3264(local_780);
                      auVar194 = ZEXT3264(local_760);
                      auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                                    CONCAT424(fStack_648,
                                                              CONCAT420(fStack_64c,
                                                                        CONCAT416(fStack_650,
                                                                                  CONCAT412(
                                                  fStack_654,
                                                  CONCAT48(fStack_658,CONCAT44(fStack_65c,local_660)
                                                          )))))));
                      auVar192 = ZEXT3264(local_5a0);
                      auVar215 = ZEXT3264(local_6c0);
                      auVar202 = ZEXT3264(local_700);
                      uVar95 = local_680;
                      uVar205 = uStack_678;
                      uVar206 = uStack_670;
                      uVar207 = uStack_668;
                    }
                    auVar75._8_8_ = uStack_798;
                    auVar75._0_8_ = local_7a0;
                    if (auVar75 == (undefined1  [16])0x0) {
                      auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar14 = auVar14 ^ _DAT_01febe20;
                      fVar150 = (float)local_740;
                      fVar154 = local_740._4_4_;
                      fVar109 = (float)uStack_738;
                      fVar111 = uStack_738._4_4_;
                      fVar113 = (float)uStack_730;
                      fVar195 = uStack_730._4_4_;
                      fVar196 = (float)uStack_728;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(CONCAT44(fStack_47c,local_480) + 0x3e) & 0x40) != 0)))) {
                        auVar174 = ZEXT1664(auVar174._0_16_);
                        (*p_Var13)(&local_630);
                        auVar209 = ZEXT3264(local_600);
                        auVar216 = ZEXT3264(local_780);
                        auVar194 = ZEXT3264(local_760);
                        auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                                      CONCAT424(fStack_648,
                                                                CONCAT420(fStack_64c,
                                                                          CONCAT416(fStack_650,
                                                                                    CONCAT412(
                                                  fStack_654,
                                                  CONCAT48(fStack_658,CONCAT44(fStack_65c,local_660)
                                                          )))))));
                        auVar192 = ZEXT3264(local_5a0);
                        auVar215 = ZEXT3264(local_6c0);
                        auVar202 = ZEXT3264(local_700);
                        uVar95 = local_680;
                        uVar205 = uStack_678;
                        uVar206 = uStack_670;
                        uVar207 = uStack_668;
                      }
                      auVar76._8_8_ = uStack_798;
                      auVar76._0_8_ = local_7a0;
                      auVar15 = vpcmpeqd_avx((undefined1  [16])0x0,auVar76);
                      auVar14 = auVar15 ^ _DAT_01febe20;
                      auVar140._8_4_ = 0xff800000;
                      auVar140._0_8_ = 0xff800000ff800000;
                      auVar140._12_4_ = 0xff800000;
                      auVar149 = ZEXT1664(auVar140);
                      auVar15 = vblendvps_avx(auVar140,*(undefined1 (*) [16])(local_630.ray + 0x80),
                                              auVar15);
                      *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar15;
                      fVar150 = (float)local_740;
                      fVar154 = local_740._4_4_;
                      fVar109 = (float)uStack_738;
                      fVar111 = uStack_738._4_4_;
                      fVar113 = (float)uStack_730;
                      fVar195 = uStack_730._4_4_;
                      fVar196 = (float)uStack_728;
                    }
                    auVar122._8_8_ = 0x100000001;
                    auVar122._0_8_ = 0x100000001;
                    if ((auVar122 & auVar14) != (undefined1  [16])0x0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar94;
                    uVar85 = _local_840 & 0x3f;
                    _local_840 = 0;
                    uVar90 = uVar90 ^ 1L << uVar85;
                    for (uVar85 = uVar90; (uVar85 & 1) == 0;
                        uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                      _local_840 = _local_840 + 1;
                    }
                    local_6a0._0_4_ = (int)CONCAT71((int7)(_local_840 >> 8),uVar90 != 0);
                  } while (uVar90 != 0);
                }
                pRVar86 = (RTCIntersectArguments *)
                          ((ulong)(uint)local_6a0._0_4_ & 0xffffffffffffff01);
                uStack_670 = uVar206;
                uStack_668 = uVar207;
              }
            }
            auVar133 = ZEXT3264(local_6e0);
          }
        }
      }
      if (8 < iVar10) {
        local_600 = auVar209._0_32_;
        local_460._4_4_ = iVar10;
        local_460._0_4_ = iVar10;
        local_460._8_4_ = iVar10;
        local_460._12_4_ = iVar10;
        local_460._16_4_ = iVar10;
        local_460._20_4_ = iVar10;
        local_460._24_4_ = iVar10;
        local_460._28_4_ = iVar10;
        local_100 = local_5c0._0_4_;
        uStack_fc = local_5c0._0_4_;
        uStack_f8 = local_5c0._0_4_;
        uStack_f4 = local_5c0._0_4_;
        uStack_f0 = local_5c0._0_4_;
        uStack_ec = local_5c0._0_4_;
        uStack_e8 = local_5c0._0_4_;
        uStack_e4 = local_5c0._0_4_;
        local_120 = 1.0 / (float)local_570._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_570._4_4_ = (undefined4)local_788;
        local_570._0_4_ = (undefined4)local_788;
        uStack_568 = (undefined4)local_788;
        uStack_564 = (undefined4)local_788;
        uStack_57c = local_580;
        uStack_578 = local_580;
        uStack_574 = local_580;
        lVar91 = 8;
        local_700 = auVar202._0_32_;
        uStack_678 = uVar205;
        local_680 = uVar95;
        local_480 = fVar136;
        fStack_47c = fVar136;
        fStack_478 = fVar136;
        fStack_474 = fVar136;
        fStack_470 = fVar136;
        fStack_46c = fVar136;
        fStack_468 = fVar136;
        fStack_464 = fVar136;
        do {
          local_6a0._0_4_ = (int)pRVar86;
          auVar130 = *(undefined1 (*) [32])(bezier_basis0 + lVar91 * 4 + lVar23);
          auVar7 = *(undefined1 (*) [32])(lVar23 + 0x2227768 + lVar91 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar23 + 0x2227bec + lVar91 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar23 + 0x2228070 + lVar91 * 4);
          auVar84 = *pauVar2;
          auVar175._0_4_ = auVar179._0_4_ * *(float *)*pauVar2;
          auVar175._4_4_ = auVar179._4_4_ * *(float *)(*pauVar2 + 4);
          auVar175._8_4_ = auVar179._8_4_ * *(float *)(*pauVar2 + 8);
          auVar175._12_4_ = auVar179._12_4_ * *(float *)(*pauVar2 + 0xc);
          auVar175._16_4_ = auVar179._16_4_ * *(float *)(*pauVar2 + 0x10);
          auVar175._20_4_ = auVar179._20_4_ * *(float *)(*pauVar2 + 0x14);
          auVar175._28_36_ = auVar174._28_36_;
          auVar175._24_4_ = auVar179._24_4_ * *(float *)(*pauVar2 + 0x18);
          auVar174._0_4_ = fVar150 * *(float *)*pauVar2;
          auVar174._4_4_ = fVar154 * *(float *)(*pauVar2 + 4);
          auVar174._8_4_ = fVar109 * *(float *)(*pauVar2 + 8);
          auVar174._12_4_ = fVar111 * *(float *)(*pauVar2 + 0xc);
          auVar174._16_4_ = fVar113 * *(float *)(*pauVar2 + 0x10);
          auVar174._20_4_ = fVar195 * *(float *)(*pauVar2 + 0x14);
          auVar174._28_36_ = auVar149._28_36_;
          auVar174._24_4_ = fVar196 * *(float *)(*pauVar2 + 0x18);
          auVar14 = vfmadd231ps_fma(auVar175._0_32_,auVar108,auVar215._0_32_);
          auVar187 = auVar192._0_32_;
          auVar15 = vfmadd231ps_fma(auVar174._0_32_,auVar108,auVar187);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar7,auVar194._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar7,auVar133._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar130,auVar216._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar130,local_420);
          auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar91 * 4 + lVar23);
          auVar191 = *(undefined1 (*) [32])(lVar23 + 0x2229b88 + lVar91 * 4);
          auVar8 = *(undefined1 (*) [32])(lVar23 + 0x222a00c + lVar91 * 4);
          pfVar3 = (float *)(lVar23 + 0x222a490 + lVar91 * 4);
          fVar136 = *pfVar3;
          fVar135 = pfVar3[1];
          fVar110 = pfVar3[2];
          fVar112 = pfVar3[3];
          fVar114 = pfVar3[4];
          fVar115 = pfVar3[5];
          fVar116 = pfVar3[6];
          auVar180._0_4_ = fVar136 * auVar179._0_4_;
          auVar180._4_4_ = fVar135 * auVar179._4_4_;
          auVar180._8_4_ = fVar110 * auVar179._8_4_;
          auVar180._12_4_ = fVar112 * auVar179._12_4_;
          auVar180._16_4_ = fVar114 * auVar179._16_4_;
          auVar180._20_4_ = fVar115 * auVar179._20_4_;
          auVar180._28_36_ = auVar179._28_36_;
          auVar180._24_4_ = fVar116 * auVar179._24_4_;
          auVar210._0_4_ = fVar136 * fVar150;
          auVar210._4_4_ = fVar135 * fVar154;
          auVar210._8_4_ = fVar110 * fVar109;
          auVar210._12_4_ = fVar112 * fVar111;
          auVar210._16_4_ = fVar114 * fVar113;
          auVar210._20_4_ = fVar115 * fVar195;
          auVar210._28_36_ = auVar209._28_36_;
          auVar210._24_4_ = fVar116 * fVar196;
          auVar16 = vfmadd231ps_fma(auVar180._0_32_,auVar8,auVar215._0_32_);
          auVar17 = vfmadd231ps_fma(auVar210._0_32_,auVar8,auVar187);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar191,auVar194._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar191,auVar133._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar129,auVar216._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar129,local_420);
          auVar172 = ZEXT1632(auVar14);
          auVar102 = vsubps_avx(ZEXT1632(auVar16),auVar172);
          auVar101 = ZEXT1632(auVar17);
          local_5c0 = ZEXT1632(auVar15);
          auVar20 = vsubps_avx(auVar101,local_5c0);
          auVar21._4_4_ = auVar102._4_4_ * auVar15._4_4_;
          auVar21._0_4_ = auVar102._0_4_ * auVar15._0_4_;
          auVar21._8_4_ = auVar102._8_4_ * auVar15._8_4_;
          auVar21._12_4_ = auVar102._12_4_ * auVar15._12_4_;
          auVar21._16_4_ = auVar102._16_4_ * 0.0;
          auVar21._20_4_ = auVar102._20_4_ * 0.0;
          auVar21._24_4_ = auVar102._24_4_ * 0.0;
          auVar21._28_4_ = auVar215._28_4_;
          fVar109 = auVar20._0_4_;
          auVar149._0_4_ = fVar109 * auVar14._0_4_;
          fVar111 = auVar20._4_4_;
          auVar149._4_4_ = fVar111 * auVar14._4_4_;
          fVar113 = auVar20._8_4_;
          auVar149._8_4_ = fVar113 * auVar14._8_4_;
          fVar195 = auVar20._12_4_;
          auVar149._12_4_ = fVar195 * auVar14._12_4_;
          fVar196 = auVar20._16_4_;
          auVar149._16_4_ = fVar196 * 0.0;
          fVar117 = auVar20._20_4_;
          auVar149._20_4_ = fVar117 * 0.0;
          auVar149._28_36_ = auVar133._28_36_;
          fVar197 = auVar20._24_4_;
          auVar149._24_4_ = fVar197 * 0.0;
          auVar21 = vsubps_avx(auVar21,auVar149._0_32_);
          local_7c0._0_4_ = auVar84._0_4_;
          local_7c0._4_4_ = auVar84._4_4_;
          fStack_7b8 = auVar84._8_4_;
          fStack_7b4 = auVar84._12_4_;
          fStack_7b0 = auVar84._16_4_;
          fStack_7ac = auVar84._20_4_;
          fStack_7a8 = auVar84._24_4_;
          auVar45._4_4_ = local_e0._4_4_ * local_7c0._4_4_;
          auVar45._0_4_ = (float)local_e0 * (float)local_7c0;
          auVar45._8_4_ = (float)uStack_d8 * fStack_7b8;
          auVar45._12_4_ = uStack_d8._4_4_ * fStack_7b4;
          auVar45._16_4_ = (float)uStack_d0 * fStack_7b0;
          auVar45._20_4_ = uStack_d0._4_4_ * fStack_7ac;
          auVar45._24_4_ = (float)uStack_c8 * fStack_7a8;
          auVar45._28_4_ = auVar133._28_4_;
          auVar15 = vfmadd231ps_fma(auVar45,local_c0,auVar108);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_a0,auVar7);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_80,auVar130);
          auVar46._4_4_ = local_e0._4_4_ * fVar135;
          auVar46._0_4_ = (float)local_e0 * fVar136;
          auVar46._8_4_ = (float)uStack_d8 * fVar110;
          auVar46._12_4_ = uStack_d8._4_4_ * fVar112;
          auVar46._16_4_ = (float)uStack_d0 * fVar114;
          auVar46._20_4_ = uStack_d0._4_4_ * fVar115;
          auVar46._24_4_ = (float)uStack_c8 * fVar116;
          auVar46._28_4_ = uStack_c8._4_4_;
          auVar17 = vfmadd231ps_fma(auVar46,auVar8,local_c0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar191,local_a0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar129,local_80);
          auVar209 = ZEXT1664(auVar17);
          auVar174 = ZEXT3264(auVar187);
          auVar179._0_4_ = fVar109 * fVar109;
          auVar179._4_4_ = fVar111 * fVar111;
          auVar179._8_4_ = fVar113 * fVar113;
          auVar179._12_4_ = fVar195 * fVar195;
          auVar179._16_4_ = fVar196 * fVar196;
          auVar179._20_4_ = fVar117 * fVar117;
          auVar179._28_36_ = auVar192._28_36_;
          auVar179._24_4_ = fVar197 * fVar197;
          auVar18 = vfmadd231ps_fma(auVar179._0_32_,auVar102,auVar102);
          auVar149 = ZEXT3264(local_6c0);
          auVar131 = ZEXT1632(auVar15);
          auVar103 = ZEXT1632(auVar17);
          auVar147 = vmaxps_avx(auVar131,auVar103);
          auVar188._0_4_ = auVar147._0_4_ * auVar147._0_4_ * auVar18._0_4_;
          auVar188._4_4_ = auVar147._4_4_ * auVar147._4_4_ * auVar18._4_4_;
          auVar188._8_4_ = auVar147._8_4_ * auVar147._8_4_ * auVar18._8_4_;
          auVar188._12_4_ = auVar147._12_4_ * auVar147._12_4_ * auVar18._12_4_;
          auVar188._16_4_ = auVar147._16_4_ * auVar147._16_4_ * 0.0;
          auVar188._20_4_ = auVar147._20_4_ * auVar147._20_4_ * 0.0;
          auVar188._24_4_ = auVar147._24_4_ * auVar147._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar47._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar47._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar47._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar47._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar47._16_4_ = auVar21._16_4_ * auVar21._16_4_;
          auVar47._20_4_ = auVar21._20_4_ * auVar21._20_4_;
          auVar47._24_4_ = auVar21._24_4_ * auVar21._24_4_;
          auVar47._28_4_ = auVar21._28_4_;
          auVar147 = vcmpps_avx(auVar47,auVar188,2);
          local_280 = (int)lVar91;
          auVar189._4_4_ = local_280;
          auVar189._0_4_ = local_280;
          auVar189._8_4_ = local_280;
          auVar189._12_4_ = local_280;
          auVar189._16_4_ = local_280;
          auVar189._20_4_ = local_280;
          auVar189._24_4_ = local_280;
          auVar189._28_4_ = local_280;
          auVar21 = vpor_avx2(auVar189,_DAT_0205a920);
          auVar22 = vpcmpgtd_avx2(local_460,auVar21);
          auVar21 = auVar22 & auVar147;
          fVar150 = (float)local_740;
          fVar154 = local_740._4_4_;
          fVar109 = (float)uStack_738;
          fVar111 = uStack_738._4_4_;
          fVar113 = (float)uStack_730;
          fVar195 = uStack_730._4_4_;
          fVar196 = (float)uStack_728;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
            auVar133 = ZEXT3264(local_6e0);
            auVar215 = ZEXT3264(local_6c0);
            auVar192 = ZEXT3264(auVar187);
            auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                          CONCAT424(fStack_648,
                                                    CONCAT420(fStack_64c,
                                                              CONCAT416(fStack_650,
                                                                        CONCAT412(fStack_654,
                                                                                  CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            auVar194 = ZEXT3264(local_760);
            auVar216 = ZEXT3264(local_780);
            pRVar86 = (RTCIntersectArguments *)((ulong)pRVar86 & 0xffffffff);
          }
          else {
            auVar21 = vandps_avx(auVar22,auVar147);
            auVar48._4_4_ = fVar135 * local_680._4_4_;
            auVar48._0_4_ = fVar136 * (float)local_680;
            auVar48._8_4_ = fVar110 * (float)uStack_678;
            auVar48._12_4_ = fVar112 * uStack_678._4_4_;
            auVar48._16_4_ = fVar114 * (float)uStack_670;
            auVar48._20_4_ = fVar115 * uStack_670._4_4_;
            auVar48._24_4_ = fVar116 * (float)uStack_668;
            auVar48._28_4_ = auVar147._28_4_;
            auVar15 = vfmadd213ps_fma(auVar8,local_440,auVar48);
            auVar15 = vfmadd213ps_fma(auVar191,local_140,ZEXT1632(auVar15));
            auVar15 = vfmadd132ps_fma(auVar129,ZEXT1632(auVar15),local_600);
            local_320 = ZEXT1632(auVar15);
            auVar49._4_4_ = local_680._4_4_ * local_7c0._4_4_;
            auVar49._0_4_ = (float)local_680 * (float)local_7c0;
            auVar49._8_4_ = (float)uStack_678 * fStack_7b8;
            auVar49._12_4_ = uStack_678._4_4_ * fStack_7b4;
            auVar49._16_4_ = (float)uStack_670 * fStack_7b0;
            auVar49._20_4_ = uStack_670._4_4_ * fStack_7ac;
            auVar49._24_4_ = (float)uStack_668 * fStack_7a8;
            auVar49._28_4_ = auVar147._28_4_;
            auVar15 = vfmadd213ps_fma(auVar108,local_440,auVar49);
            auVar15 = vfmadd213ps_fma(auVar7,local_140,ZEXT1632(auVar15));
            auVar7 = *(undefined1 (*) [32])(lVar23 + 0x22284f4 + lVar91 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar23 + 0x2228978 + lVar91 * 4);
            auVar129 = *(undefined1 (*) [32])(lVar23 + 0x2228dfc + lVar91 * 4);
            pfVar4 = (float *)(lVar23 + 0x2229280 + lVar91 * 4);
            fVar136 = *pfVar4;
            fVar135 = pfVar4[1];
            fVar110 = pfVar4[2];
            fVar112 = pfVar4[3];
            fVar114 = pfVar4[4];
            fVar115 = pfVar4[5];
            fVar116 = pfVar4[6];
            auVar183._0_4_ = fVar136 * local_660;
            auVar183._4_4_ = fVar135 * fStack_65c;
            auVar183._8_4_ = fVar110 * fStack_658;
            auVar183._12_4_ = fVar112 * fStack_654;
            auVar183._16_4_ = fVar114 * fStack_650;
            auVar183._20_4_ = fVar115 * fStack_64c;
            auVar183._24_4_ = fVar116 * fStack_648;
            auVar183._28_4_ = 0;
            auVar50._4_4_ = fVar135 * local_740._4_4_;
            auVar50._0_4_ = fVar136 * (float)local_740;
            auVar50._8_4_ = fVar110 * (float)uStack_738;
            auVar50._12_4_ = fVar112 * uStack_738._4_4_;
            auVar50._16_4_ = fVar114 * (float)uStack_730;
            auVar50._20_4_ = fVar115 * uStack_730._4_4_;
            auVar50._24_4_ = fVar116 * (float)uStack_728;
            auVar50._28_4_ = pfVar3[7];
            auVar51._4_4_ = fVar135 * local_680._4_4_;
            auVar51._0_4_ = fVar136 * (float)local_680;
            auVar51._8_4_ = fVar110 * (float)uStack_678;
            auVar51._12_4_ = fVar112 * uStack_678._4_4_;
            auVar51._16_4_ = fVar114 * (float)uStack_670;
            auVar51._20_4_ = fVar115 * uStack_670._4_4_;
            auVar51._24_4_ = fVar116 * (float)uStack_668;
            auVar51._28_4_ = pfVar4[7];
            auVar18 = vfmadd231ps_fma(auVar183,auVar129,local_6c0);
            auVar19 = vfmadd231ps_fma(auVar50,auVar129,auVar187);
            auVar99 = vfmadd231ps_fma(auVar51,local_440,auVar129);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar108,local_760);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar108,local_6e0);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_140,auVar108);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar7,local_780);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar7,local_420);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar7,local_600);
            pfVar3 = (float *)(lVar23 + 0x222b6a0 + lVar91 * 4);
            fVar136 = *pfVar3;
            fVar135 = pfVar3[1];
            fVar110 = pfVar3[2];
            fVar112 = pfVar3[3];
            fVar114 = pfVar3[4];
            fVar115 = pfVar3[5];
            fVar116 = pfVar3[6];
            auVar52._4_4_ = fStack_65c * fVar135;
            auVar52._0_4_ = local_660 * fVar136;
            auVar52._8_4_ = fStack_658 * fVar110;
            auVar52._12_4_ = fStack_654 * fVar112;
            auVar52._16_4_ = fStack_650 * fVar114;
            auVar52._20_4_ = fStack_64c * fVar115;
            auVar52._24_4_ = fStack_648 * fVar116;
            auVar52._28_4_ = local_140._28_4_;
            auVar53._4_4_ = local_740._4_4_ * fVar135;
            auVar53._0_4_ = (float)local_740 * fVar136;
            auVar53._8_4_ = (float)uStack_738 * fVar110;
            auVar53._12_4_ = uStack_738._4_4_ * fVar112;
            auVar53._16_4_ = (float)uStack_730 * fVar114;
            auVar53._20_4_ = uStack_730._4_4_ * fVar115;
            auVar53._24_4_ = (float)uStack_728 * fVar116;
            auVar53._28_4_ = auVar102._28_4_;
            auVar54._4_4_ = fVar135 * local_680._4_4_;
            auVar54._0_4_ = fVar136 * (float)local_680;
            auVar54._8_4_ = fVar110 * (float)uStack_678;
            auVar54._12_4_ = fVar112 * uStack_678._4_4_;
            auVar54._16_4_ = fVar114 * (float)uStack_670;
            auVar54._20_4_ = fVar115 * uStack_670._4_4_;
            auVar54._24_4_ = fVar116 * (float)uStack_668;
            auVar54._28_4_ = pfVar3[7];
            auVar7 = *(undefined1 (*) [32])(lVar23 + 0x222b21c + lVar91 * 4);
            auVar98 = vfmadd231ps_fma(auVar52,auVar7,local_6c0);
            auVar137 = vfmadd231ps_fma(auVar53,auVar7,local_5a0);
            auVar120 = vfmadd231ps_fma(auVar54,local_440,auVar7);
            auVar7 = *(undefined1 (*) [32])(lVar23 + 0x222ad98 + lVar91 * 4);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar7,local_760);
            auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar7,local_6e0);
            auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar7,local_140);
            auVar7 = *(undefined1 (*) [32])(lVar23 + 0x222a914 + lVar91 * 4);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar7,local_780);
            auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar7,local_420);
            auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),local_600,auVar7);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar190._16_4_ = 0x7fffffff;
            auVar190._20_4_ = 0x7fffffff;
            auVar190._24_4_ = 0x7fffffff;
            auVar190._28_4_ = 0x7fffffff;
            auVar7 = vandps_avx(ZEXT1632(auVar18),auVar190);
            auVar108 = vandps_avx(ZEXT1632(auVar19),auVar190);
            auVar108 = vmaxps_avx(auVar7,auVar108);
            auVar7 = vandps_avx(ZEXT1632(auVar99),auVar190);
            auVar7 = vmaxps_avx(auVar108,auVar7);
            auVar81._4_4_ = fStack_47c;
            auVar81._0_4_ = local_480;
            auVar81._8_4_ = fStack_478;
            auVar81._12_4_ = fStack_474;
            auVar81._16_4_ = fStack_470;
            auVar81._20_4_ = fStack_46c;
            auVar81._24_4_ = fStack_468;
            auVar81._28_4_ = fStack_464;
            auVar7 = vcmpps_avx(auVar7,auVar81,1);
            auVar129 = vblendvps_avx(ZEXT1632(auVar18),auVar102,auVar7);
            auVar191 = vblendvps_avx(ZEXT1632(auVar19),auVar20,auVar7);
            auVar7 = vandps_avx(ZEXT1632(auVar98),auVar190);
            auVar108 = vandps_avx(ZEXT1632(auVar137),auVar190);
            auVar108 = vmaxps_avx(auVar7,auVar108);
            auVar7 = vandps_avx(auVar190,ZEXT1632(auVar120));
            auVar7 = vmaxps_avx(auVar108,auVar7);
            auVar108 = vcmpps_avx(auVar7,auVar81,1);
            auVar7 = vblendvps_avx(ZEXT1632(auVar98),auVar102,auVar108);
            auVar108 = vblendvps_avx(ZEXT1632(auVar137),auVar20,auVar108);
            auVar15 = vfmadd213ps_fma(auVar130,local_600,ZEXT1632(auVar15));
            auVar18 = vfmadd213ps_fma(auVar129,auVar129,ZEXT832(0) << 0x20);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar191,auVar191);
            auVar130 = vrsqrtps_avx(ZEXT1632(auVar18));
            fVar136 = auVar130._0_4_;
            fVar135 = auVar130._4_4_;
            fVar110 = auVar130._8_4_;
            fVar112 = auVar130._12_4_;
            fVar114 = auVar130._16_4_;
            fVar115 = auVar130._20_4_;
            fVar116 = auVar130._24_4_;
            auVar55._4_4_ = fVar135 * fVar135 * fVar135 * auVar18._4_4_ * -0.5;
            auVar55._0_4_ = fVar136 * fVar136 * fVar136 * auVar18._0_4_ * -0.5;
            auVar55._8_4_ = fVar110 * fVar110 * fVar110 * auVar18._8_4_ * -0.5;
            auVar55._12_4_ = fVar112 * fVar112 * fVar112 * auVar18._12_4_ * -0.5;
            auVar55._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar55._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar55._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar55._28_4_ = 0;
            auVar214._8_4_ = 0x3fc00000;
            auVar214._0_8_ = 0x3fc000003fc00000;
            auVar214._12_4_ = 0x3fc00000;
            auVar214._16_4_ = 0x3fc00000;
            auVar214._20_4_ = 0x3fc00000;
            auVar214._24_4_ = 0x3fc00000;
            auVar214._28_4_ = 0x3fc00000;
            auVar18 = vfmadd231ps_fma(auVar55,auVar214,auVar130);
            fVar136 = auVar18._0_4_;
            fVar135 = auVar18._4_4_;
            auVar56._4_4_ = auVar191._4_4_ * fVar135;
            auVar56._0_4_ = auVar191._0_4_ * fVar136;
            fVar110 = auVar18._8_4_;
            auVar56._8_4_ = auVar191._8_4_ * fVar110;
            fVar112 = auVar18._12_4_;
            auVar56._12_4_ = auVar191._12_4_ * fVar112;
            auVar56._16_4_ = auVar191._16_4_ * 0.0;
            auVar56._20_4_ = auVar191._20_4_ * 0.0;
            auVar56._24_4_ = auVar191._24_4_ * 0.0;
            auVar56._28_4_ = auVar130._28_4_;
            auVar57._4_4_ = fVar135 * -auVar129._4_4_;
            auVar57._0_4_ = fVar136 * -auVar129._0_4_;
            auVar57._8_4_ = fVar110 * -auVar129._8_4_;
            auVar57._12_4_ = fVar112 * -auVar129._12_4_;
            auVar57._16_4_ = -auVar129._16_4_ * 0.0;
            auVar57._20_4_ = -auVar129._20_4_ * 0.0;
            auVar57._24_4_ = -auVar129._24_4_ * 0.0;
            auVar57._28_4_ = auVar191._28_4_;
            auVar18 = vfmadd213ps_fma(auVar7,auVar7,ZEXT832(0) << 0x20);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar108,auVar108);
            auVar130 = vrsqrtps_avx(ZEXT1632(auVar18));
            auVar58._28_4_ = local_780._28_4_;
            auVar58._0_28_ =
                 ZEXT1628(CONCAT412(fVar112 * 0.0,
                                    CONCAT48(fVar110 * 0.0,CONCAT44(fVar135 * 0.0,fVar136 * 0.0))));
            fVar136 = auVar130._0_4_;
            fVar135 = auVar130._4_4_;
            fVar110 = auVar130._8_4_;
            fVar112 = auVar130._12_4_;
            fVar114 = auVar130._16_4_;
            fVar115 = auVar130._20_4_;
            fVar116 = auVar130._24_4_;
            auVar59._4_4_ = fVar135 * fVar135 * fVar135 * auVar18._4_4_ * -0.5;
            auVar59._0_4_ = fVar136 * fVar136 * fVar136 * auVar18._0_4_ * -0.5;
            auVar59._8_4_ = fVar110 * fVar110 * fVar110 * auVar18._8_4_ * -0.5;
            auVar59._12_4_ = fVar112 * fVar112 * fVar112 * auVar18._12_4_ * -0.5;
            auVar59._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar59._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar59._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar59._28_4_ = 0;
            auVar18 = vfmadd231ps_fma(auVar59,auVar214,auVar130);
            fVar136 = auVar18._0_4_;
            fVar135 = auVar18._4_4_;
            auVar60._4_4_ = auVar108._4_4_ * fVar135;
            auVar60._0_4_ = auVar108._0_4_ * fVar136;
            fVar110 = auVar18._8_4_;
            auVar60._8_4_ = auVar108._8_4_ * fVar110;
            fVar112 = auVar18._12_4_;
            auVar60._12_4_ = auVar108._12_4_ * fVar112;
            auVar60._16_4_ = auVar108._16_4_ * 0.0;
            auVar60._20_4_ = auVar108._20_4_ * 0.0;
            auVar60._24_4_ = auVar108._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar61._4_4_ = fVar135 * -auVar7._4_4_;
            auVar61._0_4_ = fVar136 * -auVar7._0_4_;
            auVar61._8_4_ = fVar110 * -auVar7._8_4_;
            auVar61._12_4_ = fVar112 * -auVar7._12_4_;
            auVar61._16_4_ = -auVar7._16_4_ * 0.0;
            auVar61._20_4_ = -auVar7._20_4_ * 0.0;
            auVar61._24_4_ = -auVar7._24_4_ * 0.0;
            auVar61._28_4_ = auVar130._28_4_;
            auVar62._28_4_ = 0xbf000000;
            auVar62._0_28_ =
                 ZEXT1628(CONCAT412(fVar112 * 0.0,
                                    CONCAT48(fVar110 * 0.0,CONCAT44(fVar135 * 0.0,fVar136 * 0.0))));
            auVar18 = vfmadd213ps_fma(auVar56,auVar131,auVar172);
            auVar19 = vfmadd213ps_fma(auVar57,auVar131,local_5c0);
            auVar99 = vfmadd213ps_fma(auVar58,auVar131,ZEXT1632(auVar15));
            auVar97 = vfnmadd213ps_fma(auVar56,auVar131,auVar172);
            auVar98 = vfmadd213ps_fma(auVar60,auVar103,ZEXT1632(auVar16));
            auVar121 = vfnmadd213ps_fma(auVar57,auVar131,local_5c0);
            auVar137 = vfmadd213ps_fma(auVar61,auVar103,auVar101);
            auVar15 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar131,auVar58);
            auVar120 = vfmadd213ps_fma(auVar62,auVar103,local_320);
            auVar151 = vfnmadd213ps_fma(auVar60,auVar103,ZEXT1632(auVar16));
            auVar156 = vfnmadd213ps_fma(auVar61,auVar103,auVar101);
            auVar96 = vfnmadd231ps_fma(local_320,auVar103,auVar62);
            auVar130 = vsubps_avx(ZEXT1632(auVar137),ZEXT1632(auVar121));
            auVar7 = vsubps_avx(ZEXT1632(auVar120),ZEXT1632(auVar15));
            auVar63._4_4_ = auVar130._4_4_ * auVar15._4_4_;
            auVar63._0_4_ = auVar130._0_4_ * auVar15._0_4_;
            auVar63._8_4_ = auVar130._8_4_ * auVar15._8_4_;
            auVar63._12_4_ = auVar130._12_4_ * auVar15._12_4_;
            auVar63._16_4_ = auVar130._16_4_ * 0.0;
            auVar63._20_4_ = auVar130._20_4_ * 0.0;
            auVar63._24_4_ = auVar130._24_4_ * 0.0;
            auVar63._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar121),auVar7);
            auVar64._4_4_ = auVar97._4_4_ * auVar7._4_4_;
            auVar64._0_4_ = auVar97._0_4_ * auVar7._0_4_;
            auVar64._8_4_ = auVar97._8_4_ * auVar7._8_4_;
            auVar64._12_4_ = auVar97._12_4_ * auVar7._12_4_;
            auVar64._16_4_ = auVar7._16_4_ * 0.0;
            auVar64._20_4_ = auVar7._20_4_ * 0.0;
            auVar64._24_4_ = auVar7._24_4_ * 0.0;
            auVar64._28_4_ = auVar7._28_4_;
            auVar191 = ZEXT1632(auVar97);
            auVar7 = vsubps_avx(ZEXT1632(auVar98),auVar191);
            auVar147 = ZEXT1632(auVar15);
            auVar15 = vfmsub231ps_fma(auVar64,auVar147,auVar7);
            auVar65._4_4_ = auVar121._4_4_ * auVar7._4_4_;
            auVar65._0_4_ = auVar121._0_4_ * auVar7._0_4_;
            auVar65._8_4_ = auVar121._8_4_ * auVar7._8_4_;
            auVar65._12_4_ = auVar121._12_4_ * auVar7._12_4_;
            auVar65._16_4_ = auVar7._16_4_ * 0.0;
            auVar65._20_4_ = auVar7._20_4_ * 0.0;
            auVar65._24_4_ = auVar7._24_4_ * 0.0;
            auVar65._28_4_ = auVar7._28_4_;
            auVar97 = vfmsub231ps_fma(auVar65,auVar191,auVar130);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar102 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,2);
            auVar130 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar18),auVar102);
            _local_840 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar19),auVar102);
            local_5c0 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar99),auVar102);
            auVar7 = vblendvps_avx(auVar191,ZEXT1632(auVar98),auVar102);
            auVar108 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar137),auVar102);
            auVar129 = vblendvps_avx(auVar147,ZEXT1632(auVar120),auVar102);
            auVar191 = vblendvps_avx(ZEXT1632(auVar98),auVar191,auVar102);
            auVar8 = vblendvps_avx(ZEXT1632(auVar137),ZEXT1632(auVar121),auVar102);
            auVar15 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
            auVar147 = vblendvps_avx(ZEXT1632(auVar120),auVar147,auVar102);
            auVar191 = vsubps_avx(auVar191,auVar130);
            auVar8 = vsubps_avx(auVar8,_local_840);
            auVar22 = vsubps_avx(auVar147,local_5c0);
            auVar172 = vsubps_avx(auVar130,auVar7);
            auVar187 = vsubps_avx(_local_840,auVar108);
            auVar101 = vsubps_avx(local_5c0,auVar129);
            auVar167._0_4_ = auVar22._0_4_ * auVar130._0_4_;
            auVar167._4_4_ = auVar22._4_4_ * auVar130._4_4_;
            auVar167._8_4_ = auVar22._8_4_ * auVar130._8_4_;
            auVar167._12_4_ = auVar22._12_4_ * auVar130._12_4_;
            auVar167._16_4_ = auVar22._16_4_ * auVar130._16_4_;
            auVar167._20_4_ = auVar22._20_4_ * auVar130._20_4_;
            auVar167._24_4_ = auVar22._24_4_ * auVar130._24_4_;
            auVar167._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar167,local_5c0,auVar191);
            auVar66._4_4_ = auVar191._4_4_ * local_840._4_4_;
            auVar66._0_4_ = auVar191._0_4_ * local_840;
            auVar66._8_4_ = auVar191._8_4_ * local_840._8_4_;
            auVar66._12_4_ = auVar191._12_4_ * local_840._12_4_;
            auVar66._16_4_ = auVar191._16_4_ * local_840._16_4_;
            auVar66._20_4_ = auVar191._20_4_ * local_840._20_4_;
            auVar66._24_4_ = auVar191._24_4_ * local_840._24_4_;
            auVar66._28_4_ = auVar147._28_4_;
            auVar18 = vfmsub231ps_fma(auVar66,auVar130,auVar8);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632((undefined1  [16])0x0),
                                      ZEXT1632(auVar16));
            auVar168._0_4_ = auVar8._0_4_ * local_5c0._0_4_;
            auVar168._4_4_ = auVar8._4_4_ * local_5c0._4_4_;
            auVar168._8_4_ = auVar8._8_4_ * local_5c0._8_4_;
            auVar168._12_4_ = auVar8._12_4_ * local_5c0._12_4_;
            auVar168._16_4_ = auVar8._16_4_ * local_5c0._16_4_;
            auVar168._20_4_ = auVar8._20_4_ * local_5c0._20_4_;
            auVar168._24_4_ = auVar8._24_4_ * local_5c0._24_4_;
            auVar168._28_4_ = 0;
            auVar18 = vfmsub231ps_fma(auVar168,_local_840,auVar22);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632((undefined1  [16])0x0),
                                      ZEXT1632(auVar18));
            auVar149 = ZEXT1664(auVar18);
            auVar169._0_4_ = auVar101._0_4_ * auVar7._0_4_;
            auVar169._4_4_ = auVar101._4_4_ * auVar7._4_4_;
            auVar169._8_4_ = auVar101._8_4_ * auVar7._8_4_;
            auVar169._12_4_ = auVar101._12_4_ * auVar7._12_4_;
            auVar169._16_4_ = auVar101._16_4_ * auVar7._16_4_;
            auVar169._20_4_ = auVar101._20_4_ * auVar7._20_4_;
            auVar169._24_4_ = auVar101._24_4_ * auVar7._24_4_;
            auVar169._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar169,auVar172,auVar129);
            auVar67._4_4_ = auVar187._4_4_ * auVar129._4_4_;
            auVar67._0_4_ = auVar187._0_4_ * auVar129._0_4_;
            auVar67._8_4_ = auVar187._8_4_ * auVar129._8_4_;
            auVar67._12_4_ = auVar187._12_4_ * auVar129._12_4_;
            auVar67._16_4_ = auVar187._16_4_ * auVar129._16_4_;
            auVar67._20_4_ = auVar187._20_4_ * auVar129._20_4_;
            auVar67._24_4_ = auVar187._24_4_ * auVar129._24_4_;
            auVar67._28_4_ = auVar130._28_4_;
            auVar19 = vfmsub231ps_fma(auVar67,auVar108,auVar101);
            auVar68._4_4_ = auVar172._4_4_ * auVar108._4_4_;
            auVar68._0_4_ = auVar172._0_4_ * auVar108._0_4_;
            auVar68._8_4_ = auVar172._8_4_ * auVar108._8_4_;
            auVar68._12_4_ = auVar172._12_4_ * auVar108._12_4_;
            auVar68._16_4_ = auVar172._16_4_ * auVar108._16_4_;
            auVar68._20_4_ = auVar172._20_4_ * auVar108._20_4_;
            auVar68._24_4_ = auVar172._24_4_ * auVar108._24_4_;
            auVar68._28_4_ = auVar108._28_4_;
            auVar99 = vfmsub231ps_fma(auVar68,auVar187,auVar7);
            auVar108 = ZEXT1632((undefined1  [16])0x0);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar108,ZEXT1632(auVar16));
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar108,ZEXT1632(auVar19));
            auVar7 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
            auVar7 = vcmpps_avx(auVar7,auVar108,2);
            auVar99 = auVar7._16_16_;
            auVar16 = vpackssdw_avx(auVar7._0_16_,auVar99);
            auVar15 = vpand_avx(auVar16,auVar15);
            auVar7 = vpmovsxwd_avx2(auVar15);
            if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar7 >> 0x7f,0) == '\0') &&
                  (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar7 >> 0xbf,0) == '\0') &&
                (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar7[0x1f]) {
LAB_0164bd5d:
              auVar153._8_8_ = uStack_498;
              auVar153._0_8_ = local_4a0;
              auVar153._16_8_ = uStack_490;
              auVar153._24_8_ = uStack_488;
              auVar174 = ZEXT1664(auVar99);
            }
            else {
              auVar69._4_4_ = auVar8._4_4_ * auVar101._4_4_;
              auVar69._0_4_ = auVar8._0_4_ * auVar101._0_4_;
              auVar69._8_4_ = auVar8._8_4_ * auVar101._8_4_;
              auVar69._12_4_ = auVar8._12_4_ * auVar101._12_4_;
              auVar69._16_4_ = auVar8._16_4_ * auVar101._16_4_;
              auVar69._20_4_ = auVar8._20_4_ * auVar101._20_4_;
              auVar69._24_4_ = auVar8._24_4_ * auVar101._24_4_;
              auVar69._28_4_ = auVar7._28_4_;
              auVar137 = vfmsub231ps_fma(auVar69,auVar187,auVar22);
              auVar173._0_4_ = auVar22._0_4_ * auVar172._0_4_;
              auVar173._4_4_ = auVar22._4_4_ * auVar172._4_4_;
              auVar173._8_4_ = auVar22._8_4_ * auVar172._8_4_;
              auVar173._12_4_ = auVar22._12_4_ * auVar172._12_4_;
              auVar173._16_4_ = auVar22._16_4_ * auVar172._16_4_;
              auVar173._20_4_ = auVar22._20_4_ * auVar172._20_4_;
              auVar173._24_4_ = auVar22._24_4_ * auVar172._24_4_;
              auVar173._28_4_ = 0;
              auVar99 = vfmsub231ps_fma(auVar173,auVar191,auVar101);
              auVar70._4_4_ = auVar191._4_4_ * auVar187._4_4_;
              auVar70._0_4_ = auVar191._0_4_ * auVar187._0_4_;
              auVar70._8_4_ = auVar191._8_4_ * auVar187._8_4_;
              auVar70._12_4_ = auVar191._12_4_ * auVar187._12_4_;
              auVar70._16_4_ = auVar191._16_4_ * auVar187._16_4_;
              auVar70._20_4_ = auVar191._20_4_ * auVar187._20_4_;
              auVar70._24_4_ = auVar191._24_4_ * auVar187._24_4_;
              auVar70._28_4_ = auVar187._28_4_;
              auVar120 = vfmsub231ps_fma(auVar70,auVar172,auVar8);
              auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar120));
              auVar98 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar137),auVar108);
              auVar7 = vrcpps_avx(ZEXT1632(auVar98));
              auVar204._8_4_ = 0x3f800000;
              auVar204._0_8_ = &DAT_3f8000003f800000;
              auVar204._12_4_ = 0x3f800000;
              auVar204._16_4_ = 0x3f800000;
              auVar204._20_4_ = 0x3f800000;
              auVar204._24_4_ = 0x3f800000;
              auVar204._28_4_ = 0x3f800000;
              auVar16 = vfnmadd213ps_fma(auVar7,ZEXT1632(auVar98),auVar204);
              auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar7,auVar7);
              auVar71._4_4_ = auVar120._4_4_ * local_5c0._4_4_;
              auVar71._0_4_ = auVar120._0_4_ * local_5c0._0_4_;
              auVar71._8_4_ = auVar120._8_4_ * local_5c0._8_4_;
              auVar71._12_4_ = auVar120._12_4_ * local_5c0._12_4_;
              auVar71._16_4_ = local_5c0._16_4_ * 0.0;
              auVar71._20_4_ = local_5c0._20_4_ * 0.0;
              auVar71._24_4_ = local_5c0._24_4_ * 0.0;
              auVar71._28_4_ = local_840._28_4_;
              auVar99 = vfmadd231ps_fma(auVar71,ZEXT1632(auVar99),_local_840);
              auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT1632(auVar137),auVar130);
              fVar136 = auVar16._0_4_;
              fVar135 = auVar16._4_4_;
              fVar110 = auVar16._8_4_;
              fVar112 = auVar16._12_4_;
              auVar108 = ZEXT1632(CONCAT412(fVar112 * auVar99._12_4_,
                                            CONCAT48(fVar110 * auVar99._8_4_,
                                                     CONCAT44(fVar135 * auVar99._4_4_,
                                                              fVar136 * auVar99._0_4_))));
              uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar152._4_4_ = uVar94;
              auVar152._0_4_ = uVar94;
              auVar152._8_4_ = uVar94;
              auVar152._12_4_ = uVar94;
              auVar152._16_4_ = uVar94;
              auVar152._20_4_ = uVar94;
              auVar152._24_4_ = uVar94;
              auVar152._28_4_ = uVar94;
              auVar82._4_4_ = uStack_fc;
              auVar82._0_4_ = local_100;
              auVar82._8_4_ = uStack_f8;
              auVar82._12_4_ = uStack_f4;
              auVar82._16_4_ = uStack_f0;
              auVar82._20_4_ = uStack_ec;
              auVar82._24_4_ = uStack_e8;
              auVar82._28_4_ = uStack_e4;
              auVar130 = vcmpps_avx(auVar82,auVar108,2);
              auVar7 = vcmpps_avx(auVar108,auVar152,2);
              auVar130 = vandps_avx(auVar7,auVar130);
              auVar16 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
              auVar15 = vpand_avx(auVar15,auVar16);
              auVar130 = vpmovsxwd_avx2(auVar15);
              auVar99 = ZEXT816(0) << 0x20;
              if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar130 >> 0x7f,0) == '\0') &&
                    (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar130 >> 0xbf,0) == '\0') &&
                  (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar130[0x1f]) goto LAB_0164bd5d;
              auVar130 = vcmpps_avx(ZEXT1632(auVar98),ZEXT832(0) << 0x20,4);
              auVar16 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
              auVar15 = vpand_avx(auVar15,auVar16);
              auVar130 = vpmovsxwd_avx2(auVar15);
              auVar174 = ZEXT3264(auVar130);
              auVar153._8_8_ = uStack_498;
              auVar153._0_8_ = local_4a0;
              auVar153._16_8_ = uStack_490;
              auVar153._24_8_ = uStack_488;
              if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar130 >> 0x7f,0) != '\0') ||
                    (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar130 >> 0xbf,0) != '\0') ||
                  (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar130[0x1f] < '\0') {
                auVar129 = ZEXT1632(CONCAT412(fVar112 * auVar18._12_4_,
                                              CONCAT48(fVar110 * auVar18._8_4_,
                                                       CONCAT44(fVar135 * auVar18._4_4_,
                                                                fVar136 * auVar18._0_4_))));
                auVar72._28_4_ = SUB84(uStack_488,4);
                auVar72._0_28_ =
                     ZEXT1628(CONCAT412(fVar112 * auVar19._12_4_,
                                        CONCAT48(fVar110 * auVar19._8_4_,
                                                 CONCAT44(fVar135 * auVar19._4_4_,
                                                          fVar136 * auVar19._0_4_))));
                auVar184._8_4_ = 0x3f800000;
                auVar184._0_8_ = &DAT_3f8000003f800000;
                auVar184._12_4_ = 0x3f800000;
                auVar184._16_4_ = 0x3f800000;
                auVar184._20_4_ = 0x3f800000;
                auVar184._24_4_ = 0x3f800000;
                auVar184._28_4_ = 0x3f800000;
                auVar7 = vsubps_avx(auVar184,auVar129);
                _local_180 = vblendvps_avx(auVar7,auVar129,auVar102);
                auVar7 = vsubps_avx(auVar184,auVar72);
                local_360 = vblendvps_avx(auVar7,auVar72,auVar102);
                auVar149 = ZEXT3264(local_360);
                local_1a0 = auVar108;
                auVar153 = auVar130;
              }
            }
            auVar216 = ZEXT3264(local_780);
            auVar215 = ZEXT3264(local_6c0);
            auVar202 = ZEXT3264(local_700);
            auVar194 = ZEXT3264(local_760);
            auVar209 = ZEXT3264(auVar103);
            pRVar86 = (RTCIntersectArguments *)((ulong)pRVar86 & 0xffffffff);
            auVar192 = ZEXT3264(local_5a0);
            if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar153 >> 0x7f,0) == '\0') &&
                  (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar153 >> 0xbf,0) == '\0') &&
                (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar153[0x1f]) {
              auVar133 = ZEXT3264(local_6e0);
              auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                            CONCAT424(fStack_648,
                                                      CONCAT420(fStack_64c,
                                                                CONCAT416(fStack_650,
                                                                          CONCAT412(fStack_654,
                                                                                    CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            }
            else {
              auVar130 = vsubps_avx(auVar103,auVar131);
              auVar15 = vfmadd213ps_fma(auVar130,_local_180,auVar131);
              fVar136 = *(float *)((long)local_638->ray_space + k * 4 + -0x10);
              auVar73._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar136;
              auVar73._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar136;
              auVar73._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar136;
              auVar73._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar136;
              auVar73._16_4_ = fVar136 * 0.0;
              auVar73._20_4_ = fVar136 * 0.0;
              auVar73._24_4_ = fVar136 * 0.0;
              auVar73._28_4_ = fVar136;
              auVar130 = vcmpps_avx(local_1a0,auVar73,6);
              auVar7 = auVar153 & auVar130;
              auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                            CONCAT424(fStack_648,
                                                      CONCAT420(fStack_64c,
                                                                CONCAT416(fStack_650,
                                                                          CONCAT412(fStack_654,
                                                                                    CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
              if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar7 >> 0x7f,0) == '\0') &&
                    (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar7 >> 0xbf,0) == '\0') &&
                  (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar7[0x1f]) {
                auVar133 = ZEXT3264(local_6e0);
                goto LAB_0164b7a0;
              }
              local_220 = vandps_avx(auVar130,auVar153);
              auVar132._8_4_ = 0xbf800000;
              auVar132._0_8_ = 0xbf800000bf800000;
              auVar132._12_4_ = 0xbf800000;
              auVar132._16_4_ = 0xbf800000;
              auVar132._20_4_ = 0xbf800000;
              auVar132._24_4_ = 0xbf800000;
              auVar132._28_4_ = 0xbf800000;
              auVar148._8_4_ = 0x40000000;
              auVar148._0_8_ = 0x4000000040000000;
              auVar148._12_4_ = 0x40000000;
              auVar148._16_4_ = 0x40000000;
              auVar148._20_4_ = 0x40000000;
              auVar148._24_4_ = 0x40000000;
              auVar148._28_4_ = 0x40000000;
              auVar149 = ZEXT3264(auVar148);
              auVar15 = vfmadd213ps_fma(local_360,auVar148,auVar132);
              local_2e0 = _local_180;
              local_2c0 = ZEXT1632(auVar15);
              local_2a0 = local_1a0;
              local_270 = local_710;
              uStack_268 = uStack_708;
              local_260 = local_4b0._0_8_;
              uStack_258 = local_4b0._8_8_;
              local_250 = local_4c0._0_8_;
              uStack_248 = local_4c0._8_8_;
              local_240 = local_4d0;
              pGVar11 = (context->scene->geometries).items[local_788].ptr;
              local_360 = local_2c0;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                auVar83._28_4_ = 0;
                auVar83._0_28_ = _auStack_83c;
                _local_840 = auVar83 << 0x20;
                auVar133 = ZEXT3264(local_6e0);
              }
              else {
                auVar133 = ZEXT3264(local_6e0);
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (local_840 = (undefined1  [4])0x1,
                   pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_5e0 = ZEXT1632(CONCAT88(auVar14._8_8_,pGVar11));
                  fVar136 = (float)local_280;
                  auVar149 = ZEXT3264(CONCAT428(fVar136,CONCAT424(fVar136,CONCAT420(fVar136,
                                                  CONCAT416(fVar136,CONCAT412(fVar136,CONCAT48(
                                                  fVar136,CONCAT44(fVar136,fVar136))))))));
                  local_200[0] = (fVar136 + (float)local_180._0_4_ + 0.0) * local_120;
                  local_200[1] = (fVar136 + (float)local_180._4_4_ + 1.0) * fStack_11c;
                  local_200[2] = (fVar136 + fStack_178 + 2.0) * fStack_118;
                  local_200[3] = (fVar136 + fStack_174 + 3.0) * fStack_114;
                  fStack_1f0 = (fVar136 + fStack_170 + 4.0) * fStack_110;
                  fStack_1ec = (fVar136 + fStack_16c + 5.0) * fStack_10c;
                  fStack_1e8 = (fVar136 + fStack_168 + 6.0) * fStack_108;
                  fStack_1e4 = fVar136 + fStack_164 + 7.0;
                  local_360._0_8_ = auVar15._0_8_;
                  local_360._8_8_ = auVar15._8_8_;
                  local_1e0 = local_360._0_8_;
                  uStack_1d8 = local_360._8_8_;
                  uStack_1d0 = 0;
                  uStack_1c8 = 0;
                  local_1c0 = local_1a0;
                  uVar87 = vmovmskps_avx(local_220);
                  uVar89 = (uint)CONCAT71(0x22297,uVar87 != 0);
                  local_840 = (undefined1  [4])uVar89;
                  if (uVar87 != 0) {
                    lVar24 = 0;
                    local_7c0 = (ulong)(uVar87 & 0xff);
                    for (uVar85 = local_7c0; (uVar85 & 1) == 0;
                        uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                      lVar24 = lVar24 + 1;
                    }
                    local_800 = ZEXT1632(CONCAT88(auVar17._8_8_,lVar24));
                    local_500 = ZEXT1632(local_4b0);
                    local_520._16_16_ = auVar20._16_16_;
                    local_520._0_16_ = local_4c0;
                    _local_560 = ZEXT1632(local_4d0);
                    auStack_530 = auVar21._16_16_;
                    local_540 = *local_640;
                    local_27c = iVar10;
                    do {
                      local_5c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_3c0 = local_200[local_800._0_8_];
                      local_3b0 = *(undefined4 *)((long)&local_1e0 + local_800._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_1c0 + local_800._0_8_ * 4);
                      fVar111 = 1.0 - local_3c0;
                      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar111 * fVar111)),
                                                ZEXT416((uint)(local_3c0 * fVar111)),
                                                ZEXT416(0xc0000000));
                      auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_3c0 * fVar111)),
                                                ZEXT416((uint)(local_3c0 * local_3c0)),
                                                ZEXT416(0x40000000));
                      auVar174 = ZEXT464(0x40400000);
                      fVar136 = auVar14._0_4_ * 3.0;
                      fVar109 = local_3c0 * local_3c0 * 3.0;
                      auVar166._0_4_ = fVar109 * (float)local_560._0_4_;
                      auVar166._4_4_ = fVar109 * (float)local_560._4_4_;
                      auVar166._8_4_ = fVar109 * fStack_558;
                      auVar166._12_4_ = fVar109 * fStack_554;
                      auVar141._4_4_ = fVar136;
                      auVar141._0_4_ = fVar136;
                      auVar141._8_4_ = fVar136;
                      auVar141._12_4_ = fVar136;
                      auVar14 = vfmadd132ps_fma(auVar141,auVar166,local_520._0_16_);
                      fVar136 = auVar15._0_4_ * 3.0;
                      auVar159._4_4_ = fVar136;
                      auVar159._0_4_ = fVar136;
                      auVar159._8_4_ = fVar136;
                      auVar159._12_4_ = fVar136;
                      auVar14 = vfmadd132ps_fma(auVar159,auVar14,local_500._0_16_);
                      fVar136 = fVar111 * fVar111 * -3.0;
                      local_630.context = context->user;
                      auVar142._4_4_ = fVar136;
                      auVar142._0_4_ = fVar136;
                      auVar142._8_4_ = fVar136;
                      auVar142._12_4_ = fVar136;
                      auVar80._8_8_ = uStack_708;
                      auVar80._0_8_ = local_710;
                      auVar14 = vfmadd132ps_fma(auVar142,auVar14,auVar80);
                      local_3f0 = auVar14._0_4_;
                      local_3e0 = vshufps_avx(auVar14,auVar14,0x55);
                      local_3d0 = vshufps_avx(auVar14,auVar14,0xaa);
                      auVar149 = ZEXT1664(local_3d0);
                      local_3a0 = CONCAT44(uStack_57c,local_580);
                      uStack_398 = CONCAT44(uStack_574,uStack_578);
                      local_390 = _local_570;
                      vpcmpeqd_avx2(ZEXT1632(_local_570),ZEXT1632(_local_570));
                      uStack_37c = (local_630.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_630.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_7a0 = local_540._0_8_;
                      uStack_798 = local_540._8_8_;
                      local_630.valid = (int *)&local_7a0;
                      local_630.geometryUserPtr = *(void **)(local_5e0._0_8_ + 0x18);
                      local_630.hit = (RTCHitN *)&local_3f0;
                      local_630.N = 4;
                      local_630.ray = (RTCRayN *)ray;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      fStack_3bc = local_3c0;
                      fStack_3b8 = local_3c0;
                      fStack_3b4 = local_3c0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      if (*(code **)(local_5e0._0_8_ + 0x48) != (code *)0x0) {
                        auVar149 = ZEXT1664(local_3d0);
                        auVar174 = ZEXT1664(auVar174._0_16_);
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        (**(code **)(local_5e0._0_8_ + 0x48))(&local_630);
                      }
                      auVar77._8_8_ = uStack_798;
                      auVar77._0_8_ = local_7a0;
                      if (auVar77 == (undefined1  [16])0x0) {
                        auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar14 = auVar14 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_5e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar174 = ZEXT1664(auVar174._0_16_);
                          auVar209 = ZEXT1664(auVar209._0_16_);
                          (*p_Var13)(&local_630);
                        }
                        auVar78._8_8_ = uStack_798;
                        auVar78._0_8_ = local_7a0;
                        auVar15 = vpcmpeqd_avx((undefined1  [16])0x0,auVar78);
                        auVar14 = auVar15 ^ _DAT_01febe20;
                        auVar143._8_4_ = 0xff800000;
                        auVar143._0_8_ = 0xff800000ff800000;
                        auVar143._12_4_ = 0xff800000;
                        auVar149 = ZEXT1664(auVar143);
                        auVar15 = vblendvps_avx(auVar143,*(undefined1 (*) [16])
                                                          (local_630.ray + 0x80),auVar15);
                        *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar15;
                      }
                      auVar123._8_8_ = 0x100000001;
                      auVar123._0_8_ = 0x100000001;
                      if ((auVar123 & auVar14) != (undefined1  [16])0x0) break;
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_5c0._0_4_;
                      lVar24 = 0;
                      local_7c0 = local_7c0 ^ 1L << (local_800._0_8_ & 0x3f);
                      for (uVar85 = local_7c0; (uVar85 & 1) == 0;
                          uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                        lVar24 = lVar24 + 1;
                      }
                      local_800._0_8_ = lVar24;
                      local_840 = (undefined1  [4])(uint)(local_7c0 != 0);
                    } while (local_7c0 != 0);
                  }
                  auVar202 = ZEXT3264(local_700);
                  auVar133 = ZEXT3264(local_6e0);
                  auVar215 = ZEXT3264(local_6c0);
                  auVar192 = ZEXT3264(local_5a0);
                  auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                                CONCAT424(fStack_648,
                                                          CONCAT420(fStack_64c,
                                                                    CONCAT416(fStack_650,
                                                                              CONCAT412(fStack_654,
                                                                                        CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
                  auVar194 = ZEXT3264(local_760);
                  auVar216 = ZEXT3264(local_780);
                }
              }
              pRVar86 = (RTCIntersectArguments *)
                        (ulong)CONCAT31(local_6a0._1_3_,local_6a0[0] | local_840[0]);
            }
            fVar150 = (float)local_740;
            fVar154 = local_740._4_4_;
            fVar109 = (float)uStack_738;
            fVar111 = uStack_738._4_4_;
            fVar113 = (float)uStack_730;
            fVar195 = uStack_730._4_4_;
            fVar196 = (float)uStack_728;
          }
LAB_0164b7a0:
          lVar91 = lVar91 + 8;
        } while ((int)lVar91 < iVar10);
      }
      if (((ulong)pRVar86 & 1) != 0) {
        return bVar93;
      }
      uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar100._4_4_ = uVar94;
      auVar100._0_4_ = uVar94;
      auVar100._8_4_ = uVar94;
      auVar100._12_4_ = uVar94;
      auVar14 = vcmpps_avx(local_300,auVar100,2);
      uVar87 = vmovmskps_avx(auVar14);
      uVar87 = (uint)uVar92 & uVar87;
      bVar93 = uVar87 != 0;
    } while (bVar93);
  }
  return bVar93;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }